

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator_target.hpp
# Opt level: O1

Result __thiscall
ruckig::TargetCalculator<0UL,_MinimalDynamicDofsVector>::calculate<false>
          (TargetCalculator<0UL,_MinimalDynamicDofsVector> *this,
          InputParameter<0UL,_MinimalDynamicDofsVector> *inp,
          Trajectory<0UL,_MinimalDynamicDofsVector> *traj,double delta_time,bool *was_interrupted)

{
  optional<double> *poVar1;
  ControlInterface CVar2;
  DurationDiscretization DVar3;
  ControlSigns CVar4;
  pointer pMVar5;
  pointer pdVar6;
  size_t sVar7;
  _Elt_pointer pbVar8;
  _Elt_pointer pPVar9;
  undefined8 uVar10;
  undefined1 uVar11;
  undefined3 uVar12;
  double dVar13;
  char cVar14;
  bool bVar15;
  byte bVar16;
  byte bVar17;
  ulong uVar18;
  _Elt_pointer pdVar19;
  _Elt_pointer pdVar20;
  __normal_iterator<ruckig::Synchronization_*,_std::vector<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>_>
  _Var21;
  double *pdVar22;
  double *pdVar23;
  double *pdVar24;
  long lVar25;
  ControlInterface *pCVar26;
  long lVar27;
  Synchronization *pSVar28;
  _Elt_pointer pbVar29;
  long lVar30;
  double *pdVar31;
  ulong uVar32;
  _Elt_pointer pbVar33;
  ulong uVar34;
  long lVar35;
  _Elt_pointer pPVar36;
  pointer pBVar37;
  void *__src;
  long lVar38;
  Profile *pPVar39;
  ulong uVar40;
  _Storage<unsigned_long,_true> _Var41;
  Block *pBVar42;
  double *pdVar43;
  size_t sVar44;
  bool bVar45;
  undefined4 uVar46;
  uint uVar47;
  undefined4 uVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  optional<double> t_min;
  PositionFirstOrderStep1 step1;
  Result local_e74;
  _Storage<unsigned_long,_true> local_e60;
  char local_e58;
  _Map_pointer local_e50;
  Profile local_e48 [6];
  
  *was_interrupted = false;
  Trajectory<0UL,_MinimalDynamicDofsVector>::resize<0UL,_0>(traj,0);
  bVar45 = this->degrees_of_freedom != 0;
  if (bVar45) {
    uVar32 = 0;
    do {
      pMVar5 = (traj->profiles).
               super__Vector_base<MinimalDynamicDofsVector<ruckig::Profile,_0UL>,_std::allocator<MinimalDynamicDofsVector<ruckig::Profile,_0UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pPVar36 = ((iterator *)
                ((long)&(pMVar5->data).
                        super__Deque_base<ruckig::Profile,_std::allocator<ruckig::Profile>_> + 0x10)
                )->_M_cur;
      lVar25 = ((long)pPVar36 -
                (long)*(_Elt_pointer *)
                       ((long)&(pMVar5->data).
                               super__Deque_base<ruckig::Profile,_std::allocator<ruckig::Profile>_>
                       + 0x18) >> 6) * -0x71c71c71c71c71c7 + uVar32;
      if (lVar25 == 0) {
        pBVar42 = (Block *)(pPVar36 + uVar32);
      }
      else {
        pBVar42 = (Block *)(*(_Map_pointer *)
                             ((long)&(pMVar5->data).
                                     super__Deque_base<ruckig::Profile,_std::allocator<ruckig::Profile>_>
                             + 0x28))[lVar25];
      }
      if ((inp->min_velocity).
          super__Optional_base<MinimalDynamicDofsVector<double,_0UL>,_false,_false>._M_payload.
          super__Optional_payload<MinimalDynamicDofsVector<double,_0UL>,_true,_false,_false>.
          super__Optional_payload_base<MinimalDynamicDofsVector<double,_0UL>_>._M_engaged == true) {
        lVar25 = (long)((iterator *)
                       ((long)&(inp->min_velocity).
                               super__Optional_base<MinimalDynamicDofsVector<double,_0UL>,_false,_false>
                               ._M_payload.
                               super__Optional_payload<MinimalDynamicDofsVector<double,_0UL>,_true,_false,_false>
                               .super__Optional_payload_base<MinimalDynamicDofsVector<double,_0UL>_>
                               ._M_payload._M_value.data + 0x10))->_M_cur;
        uVar18 = (lVar25 - (long)*(_Elt_pointer *)
                                  ((long)&(inp->min_velocity).
                                          super__Optional_base<MinimalDynamicDofsVector<double,_0UL>,_false,_false>
                                          ._M_payload.
                                          super__Optional_payload<MinimalDynamicDofsVector<double,_0UL>,_true,_false,_false>
                                          .
                                          super__Optional_payload_base<MinimalDynamicDofsVector<double,_0UL>_>
                                          ._M_payload._M_value.data + 0x18) >> 3) + uVar32;
        if (uVar18 < 0x40) {
          pdVar43 = (double *)(lVar25 + uVar32 * 8);
        }
        else {
          uVar34 = uVar18 >> 6 | 0xfc00000000000000;
          if (0 < (long)uVar18) {
            uVar34 = uVar18 >> 6;
          }
          pdVar43 = (*(_Map_pointer *)
                      ((long)&(inp->min_velocity).
                              super__Optional_base<MinimalDynamicDofsVector<double,_0UL>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<MinimalDynamicDofsVector<double,_0UL>,_true,_false,_false>
                              .super__Optional_payload_base<MinimalDynamicDofsVector<double,_0UL>_>.
                              _M_payload._M_value.data + 0x28))[uVar34] + uVar18 + uVar34 * -0x40;
        }
        uVar46 = SUB84(*pdVar43,0);
        uVar47 = (uint)((ulong)*pdVar43 >> 0x20);
      }
      else {
        pdVar20 = (inp->max_velocity).data.super__Deque_base<double,_std::allocator<double>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur;
        uVar18 = ((long)pdVar20 -
                  (long)(inp->max_velocity).data.super__Deque_base<double,_std::allocator<double>_>.
                        _M_impl.super__Deque_impl_data._M_start._M_first >> 3) + uVar32;
        if (uVar18 < 0x40) {
          pdVar20 = pdVar20 + uVar32;
        }
        else {
          uVar34 = uVar18 >> 6 | 0xfc00000000000000;
          if (0 < (long)uVar18) {
            uVar34 = uVar18 >> 6;
          }
          pdVar20 = (inp->max_velocity).data.super__Deque_base<double,_std::allocator<double>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_node[uVar34] +
                    uVar18 + uVar34 * -0x40;
        }
        uVar46 = SUB84(*pdVar20,0);
        uVar47 = (uint)((ulong)*pdVar20 >> 0x20) ^ 0x80000000;
      }
      pdVar6 = (this->inp_min_velocity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6[uVar32] = (double)CONCAT44(uVar47,uVar46);
      if ((inp->min_acceleration).
          super__Optional_base<MinimalDynamicDofsVector<double,_0UL>,_false,_false>._M_payload.
          super__Optional_payload<MinimalDynamicDofsVector<double,_0UL>,_true,_false,_false>.
          super__Optional_payload_base<MinimalDynamicDofsVector<double,_0UL>_>._M_engaged == true) {
        lVar25 = (long)((iterator *)
                       ((long)&(inp->min_acceleration).
                               super__Optional_base<MinimalDynamicDofsVector<double,_0UL>,_false,_false>
                               ._M_payload.
                               super__Optional_payload<MinimalDynamicDofsVector<double,_0UL>,_true,_false,_false>
                               .super__Optional_payload_base<MinimalDynamicDofsVector<double,_0UL>_>
                               ._M_payload._M_value.data + 0x10))->_M_cur;
        uVar18 = (lVar25 - (long)*(_Elt_pointer *)
                                  ((long)&(inp->min_acceleration).
                                          super__Optional_base<MinimalDynamicDofsVector<double,_0UL>,_false,_false>
                                          ._M_payload.
                                          super__Optional_payload<MinimalDynamicDofsVector<double,_0UL>,_true,_false,_false>
                                          .
                                          super__Optional_payload_base<MinimalDynamicDofsVector<double,_0UL>_>
                                          ._M_payload._M_value.data + 0x18) >> 3) + uVar32;
        if (uVar18 < 0x40) {
          pdVar43 = (double *)(lVar25 + uVar32 * 8);
        }
        else {
          uVar34 = uVar18 >> 6 | 0xfc00000000000000;
          if (0 < (long)uVar18) {
            uVar34 = uVar18 >> 6;
          }
          pdVar43 = (*(_Map_pointer *)
                      ((long)&(inp->min_acceleration).
                              super__Optional_base<MinimalDynamicDofsVector<double,_0UL>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<MinimalDynamicDofsVector<double,_0UL>,_true,_false,_false>
                              .super__Optional_payload_base<MinimalDynamicDofsVector<double,_0UL>_>.
                              _M_payload._M_value.data + 0x28))[uVar34] + uVar18 + uVar34 * -0x40;
        }
        dVar51 = *pdVar43;
      }
      else {
        pdVar20 = (inp->max_acceleration).data.super__Deque_base<double,_std::allocator<double>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur;
        uVar18 = ((long)pdVar20 -
                  (long)(inp->max_acceleration).data.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_first >> 3) + uVar32;
        if (uVar18 < 0x40) {
          pdVar20 = pdVar20 + uVar32;
        }
        else {
          uVar34 = uVar18 >> 6 | 0xfc00000000000000;
          if (0 < (long)uVar18) {
            uVar34 = uVar18 >> 6;
          }
          pdVar20 = (inp->max_acceleration).data.super__Deque_base<double,_std::allocator<double>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_node[uVar34] +
                    uVar18 + uVar34 * -0x40;
        }
        dVar51 = -*pdVar20;
      }
      (this->inp_min_acceleration).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[uVar32] = dVar51;
      pCVar26 = &inp->control_interface;
      if ((inp->per_dof_control_interface).
          super__Optional_base<MinimalDynamicDofsVector<ruckig::ControlInterface,_0UL>,_false,_false>
          ._M_payload.
          super__Optional_payload<MinimalDynamicDofsVector<ruckig::ControlInterface,_0UL>,_true,_false,_false>
          .super__Optional_payload_base<MinimalDynamicDofsVector<ruckig::ControlInterface,_0UL>_>.
          _M_engaged == true) {
        lVar25 = (long)((iterator *)
                       ((long)&(inp->per_dof_control_interface).
                               super__Optional_base<MinimalDynamicDofsVector<ruckig::ControlInterface,_0UL>,_false,_false>
                               ._M_payload.
                               super__Optional_payload<MinimalDynamicDofsVector<ruckig::ControlInterface,_0UL>,_true,_false,_false>
                               .
                               super__Optional_payload_base<MinimalDynamicDofsVector<ruckig::ControlInterface,_0UL>_>
                               ._M_payload._M_value.data + 0x10))->_M_cur;
        uVar18 = (lVar25 - (long)*(_Elt_pointer *)
                                  ((long)&(inp->per_dof_control_interface).
                                          super__Optional_base<MinimalDynamicDofsVector<ruckig::ControlInterface,_0UL>,_false,_false>
                                          ._M_payload.
                                          super__Optional_payload<MinimalDynamicDofsVector<ruckig::ControlInterface,_0UL>,_true,_false,_false>
                                          .
                                          super__Optional_payload_base<MinimalDynamicDofsVector<ruckig::ControlInterface,_0UL>_>
                                          ._M_payload._M_value.data + 0x18) >> 2) + uVar32;
        if (uVar18 < 0x80) {
          pCVar26 = (ControlInterface *)(lVar25 + uVar32 * 4);
        }
        else {
          uVar34 = uVar18 >> 7 | 0xfe00000000000000;
          if (0 < (long)uVar18) {
            uVar34 = uVar18 >> 7;
          }
          pCVar26 = (*(_Map_pointer *)
                      ((long)&(inp->per_dof_control_interface).
                              super__Optional_base<MinimalDynamicDofsVector<ruckig::ControlInterface,_0UL>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<MinimalDynamicDofsVector<ruckig::ControlInterface,_0UL>,_true,_false,_false>
                              .
                              super__Optional_payload_base<MinimalDynamicDofsVector<ruckig::ControlInterface,_0UL>_>
                              ._M_payload._M_value.data + 0x28))[uVar34] + uVar18 + uVar34 * -0x80;
        }
      }
      CVar2 = *pCVar26;
      (this->inp_per_dof_control_interface).
      super__Vector_base<ruckig::ControlInterface,_std::allocator<ruckig::ControlInterface>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar32] = CVar2;
      pSVar28 = &inp->synchronization;
      if ((inp->per_dof_synchronization).
          super__Optional_base<MinimalDynamicDofsVector<ruckig::Synchronization,_0UL>,_false,_false>
          ._M_payload.
          super__Optional_payload<MinimalDynamicDofsVector<ruckig::Synchronization,_0UL>,_true,_false,_false>
          .super__Optional_payload_base<MinimalDynamicDofsVector<ruckig::Synchronization,_0UL>_>.
          _M_engaged == true) {
        lVar25 = (long)((iterator *)
                       ((long)&(inp->per_dof_synchronization).
                               super__Optional_base<MinimalDynamicDofsVector<ruckig::Synchronization,_0UL>,_false,_false>
                               ._M_payload.
                               super__Optional_payload<MinimalDynamicDofsVector<ruckig::Synchronization,_0UL>,_true,_false,_false>
                               .
                               super__Optional_payload_base<MinimalDynamicDofsVector<ruckig::Synchronization,_0UL>_>
                               ._M_payload._M_value.data + 0x10))->_M_cur;
        uVar18 = (lVar25 - (long)*(_Elt_pointer *)
                                  ((long)&(inp->per_dof_synchronization).
                                          super__Optional_base<MinimalDynamicDofsVector<ruckig::Synchronization,_0UL>,_false,_false>
                                          ._M_payload.
                                          super__Optional_payload<MinimalDynamicDofsVector<ruckig::Synchronization,_0UL>,_true,_false,_false>
                                          .
                                          super__Optional_payload_base<MinimalDynamicDofsVector<ruckig::Synchronization,_0UL>_>
                                          ._M_payload._M_value.data + 0x18) >> 2) + uVar32;
        if (uVar18 < 0x80) {
          pSVar28 = (Synchronization *)(lVar25 + uVar32 * 4);
        }
        else {
          uVar34 = uVar18 >> 7 | 0xfe00000000000000;
          if (0 < (long)uVar18) {
            uVar34 = uVar18 >> 7;
          }
          pSVar28 = (*(_Map_pointer *)
                      ((long)&(inp->per_dof_synchronization).
                              super__Optional_base<MinimalDynamicDofsVector<ruckig::Synchronization,_0UL>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<MinimalDynamicDofsVector<ruckig::Synchronization,_0UL>,_true,_false,_false>
                              .
                              super__Optional_payload_base<MinimalDynamicDofsVector<ruckig::Synchronization,_0UL>_>
                              ._M_payload._M_value.data + 0x28))[uVar34] + uVar18 + uVar34 * -0x80;
        }
      }
      (this->inp_per_dof_synchronization).
      super__Vector_base<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>._M_impl.
      super__Vector_impl_data._M_start[uVar32] = *pSVar28;
      pbVar33 = (inp->enabled).data.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur;
      pbVar29 = pbVar33 + (uVar32 - (long)(inp->enabled).data.
                                          super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                                          super__Deque_impl_data._M_start._M_first);
      if (pbVar29 < (_Elt_pointer)0x200) {
        pbVar33 = pbVar33 + uVar32;
      }
      else {
        uVar18 = (ulong)pbVar29 >> 9 | 0xff80000000000000;
        if (0 < (long)pbVar29) {
          uVar18 = (ulong)pbVar29 >> 9;
        }
        pbVar33 = (inp->enabled).data.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                  super__Deque_impl_data._M_start._M_node[uVar18] +
                  (long)(pbVar29 + uVar18 * -0x200);
      }
      if (*pbVar33 == false) {
        pdVar20 = (inp->current_position).data.super__Deque_base<double,_std::allocator<double>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur;
        uVar18 = ((long)pdVar20 -
                  (long)(inp->current_position).data.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_first >> 3) + uVar32;
        if (uVar18 < 0x40) {
          pdVar20 = pdVar20 + uVar32;
        }
        else {
          uVar34 = uVar18 >> 6 | 0xfc00000000000000;
          if (0 < (long)uVar18) {
            uVar34 = uVar18 >> 6;
          }
          pdVar20 = (inp->current_position).data.super__Deque_base<double,_std::allocator<double>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_node[uVar34] +
                    uVar18 + uVar34 * -0x40;
        }
        (pBVar42->p_min).p._M_elems[7] = *pdVar20;
        pdVar20 = (inp->current_velocity).data.super__Deque_base<double,_std::allocator<double>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur;
        uVar18 = ((long)pdVar20 -
                  (long)(inp->current_velocity).data.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_first >> 3) + uVar32;
        if (uVar18 < 0x40) {
          pdVar20 = pdVar20 + uVar32;
        }
        else {
          uVar34 = uVar18 >> 6 | 0xfc00000000000000;
          if (0 < (long)uVar18) {
            uVar34 = uVar18 >> 6;
          }
          pdVar20 = (inp->current_velocity).data.super__Deque_base<double,_std::allocator<double>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_node[uVar34] +
                    uVar18 + uVar34 * -0x40;
        }
        (pBVar42->p_min).v._M_elems[7] = *pdVar20;
        pdVar20 = (inp->current_acceleration).data.
                  super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
                  _M_start._M_cur;
        uVar18 = ((long)pdVar20 -
                  (long)(inp->current_acceleration).data.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_first >> 3) + uVar32;
        if (uVar18 < 0x40) {
          pdVar20 = pdVar20 + uVar32;
        }
        else {
          uVar34 = uVar18 >> 6 | 0xfc00000000000000;
          if (0 < (long)uVar18) {
            uVar34 = uVar18 >> 6;
          }
          pdVar20 = (inp->current_acceleration).data.
                    super__Deque_base<double,_std::allocator<double>_>._M_impl.
                    super__Deque_impl_data._M_start._M_node[uVar34] + uVar18 + uVar34 * -0x40;
        }
        (pBVar42->p_min).a._M_elems[7] = *pdVar20;
        (pBVar42->p_min).t_sum._M_elems[6] = 0.0;
        pBVar37 = (this->blocks).super__Vector_base<ruckig::Block,_std::allocator<ruckig::Block>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pBVar37[uVar32].t_min = 0.0;
        if (*(bool *)((long)&pBVar37[uVar32].a.
                             super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload +
                     0x250) == true) {
          *(bool *)((long)&pBVar37[uVar32].a.
                           super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload +
                   0x250) = false;
        }
        bVar15 = false;
        if (*(bool *)((long)&pBVar37[uVar32].b.
                             super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload +
                     0x250) == true) {
          *(bool *)((long)&pBVar37[uVar32].b.
                           super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload +
                   0x250) = false;
        }
      }
      else {
        if (CVar2 == Velocity) {
          pdVar20 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                    super__Deque_impl_data._M_start._M_cur;
          uVar18 = ((long)pdVar20 -
                    (long)(inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                          _M_impl.super__Deque_impl_data._M_start._M_first >> 3) + uVar32;
          if (uVar18 < 0x40) {
            pdVar19 = pdVar20 + uVar32;
          }
          else {
            uVar34 = uVar18 >> 6 | 0xfc00000000000000;
            if (0 < (long)uVar18) {
              uVar34 = uVar18 >> 6;
            }
            pdVar19 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                      _M_impl.super__Deque_impl_data._M_start._M_node[uVar34] +
                      uVar18 + uVar34 * -0x40;
          }
          if (ABS(*pdVar19) == INFINITY) {
            ruckig::BrakeProfile::get_second_order_velocity_brake_trajectory();
          }
          else {
            pdVar19 = (inp->current_acceleration).data.
                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_start._M_cur;
            uVar34 = ((long)pdVar19 -
                      (long)(inp->current_acceleration).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_first >> 3) + uVar32;
            if (uVar34 < 0x40) {
              pdVar43 = pdVar19 + uVar32;
            }
            else {
              uVar40 = uVar34 >> 6 | 0xfc00000000000000;
              if (0 < (long)uVar34) {
                uVar40 = uVar34 >> 6;
              }
              pdVar43 = (inp->current_acceleration).data.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_node[uVar40] + uVar34 + uVar40 * -0x40;
            }
            pdVar19 = (inp->max_acceleration).data.
                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_start._M_cur;
            uVar34 = ((long)pdVar19 -
                      (long)(inp->max_acceleration).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_first >> 3) + uVar32;
            if (uVar34 < 0x40) {
              pdVar22 = pdVar19 + uVar32;
            }
            else {
              uVar40 = uVar34 >> 6 | 0xfc00000000000000;
              if (0 < (long)uVar34) {
                uVar40 = uVar34 >> 6;
              }
              pdVar22 = (inp->max_acceleration).data.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_node[uVar40] + uVar34 + uVar40 * -0x40;
            }
            if (uVar18 < 0x40) {
              pdVar31 = pdVar20 + uVar32;
            }
            else {
              uVar34 = uVar18 >> 6 | 0xfc00000000000000;
              if (0 < (long)uVar18) {
                uVar34 = uVar18 >> 6;
              }
              pdVar31 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                        _M_impl.super__Deque_impl_data._M_start._M_node[uVar34] +
                        uVar18 + uVar34 * -0x40;
            }
            ruckig::BrakeProfile::get_velocity_brake_trajectory(*pdVar43,*pdVar22,dVar51,*pdVar31);
          }
          pdVar20 = (inp->current_position).data.super__Deque_base<double,_std::allocator<double>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur;
          uVar18 = ((long)pdVar20 -
                    (long)(inp->current_position).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_first >> 3) + uVar32;
          if (uVar18 < 0x40) {
            pdVar20 = pdVar20 + uVar32;
          }
          else {
            uVar34 = uVar18 >> 6 | 0xfc00000000000000;
            if (0 < (long)uVar18) {
              uVar34 = uVar18 >> 6;
            }
            pdVar20 = (inp->current_position).data.
                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_start._M_node[uVar34] + uVar18 + uVar34 * -0x40;
          }
          pdVar19 = (inp->current_velocity).data.super__Deque_base<double,_std::allocator<double>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur;
          dVar51 = *pdVar20;
          uVar18 = ((long)pdVar19 -
                    (long)(inp->current_velocity).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_first >> 3) + uVar32;
          if (uVar18 < 0x40) {
            pdVar19 = pdVar19 + uVar32;
          }
          else {
            uVar34 = uVar18 >> 6 | 0xfc00000000000000;
            if (0 < (long)uVar18) {
              uVar34 = uVar18 >> 6;
            }
            pdVar19 = (inp->current_velocity).data.
                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_start._M_node[uVar34] + uVar18 + uVar34 * -0x40;
          }
          pdVar20 = (inp->current_acceleration).data.
                    super__Deque_base<double,_std::allocator<double>_>._M_impl.
                    super__Deque_impl_data._M_start._M_cur;
          uVar46 = SUB84(*pdVar19,0);
          uVar48 = (undefined4)((ulong)*pdVar19 >> 0x20);
          uVar18 = ((long)pdVar20 -
                    (long)(inp->current_acceleration).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_first >> 3) + uVar32;
          if (uVar18 < 0x40) {
            pdVar20 = pdVar20 + uVar32;
          }
          else {
            uVar34 = uVar18 >> 6 | 0xfc00000000000000;
            if (0 < (long)uVar18) {
              uVar34 = uVar18 >> 6;
            }
            pdVar20 = (inp->current_acceleration).data.
                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_start._M_node[uVar34] + uVar18 + uVar34 * -0x40;
          }
          pdVar19 = (inp->target_velocity).data.super__Deque_base<double,_std::allocator<double>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur;
          dVar50 = *pdVar20;
          uVar18 = ((long)pdVar19 -
                    (long)(inp->target_velocity).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_first >> 3) + uVar32;
          if (uVar18 < 0x40) {
            pdVar19 = pdVar19 + uVar32;
          }
          else {
            uVar34 = uVar18 >> 6 | 0xfc00000000000000;
            if (0 < (long)uVar18) {
              uVar34 = uVar18 >> 6;
            }
            pdVar19 = (inp->target_velocity).data.super__Deque_base<double,_std::allocator<double>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_node[uVar34] +
                      uVar18 + uVar34 * -0x40;
          }
          pdVar20 = (inp->target_acceleration).data.
                    super__Deque_base<double,_std::allocator<double>_>._M_impl.
                    super__Deque_impl_data._M_start._M_cur;
          dVar49 = *pdVar19;
          uVar18 = ((long)pdVar20 -
                    (long)(inp->target_acceleration).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_first >> 3) + uVar32;
          if (uVar18 < 0x40) {
            pdVar20 = pdVar20 + uVar32;
          }
          else {
            uVar34 = uVar18 >> 6 | 0xfc00000000000000;
            if (0 < (long)uVar18) {
              uVar34 = uVar18 >> 6;
            }
            pdVar20 = (inp->target_acceleration).data.
                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_start._M_node[uVar34] + uVar18 + uVar34 * -0x40;
          }
          dVar52 = *pdVar20;
          lVar25 = 0x220;
          lVar27 = 0x228;
          lVar30 = 0x128;
          lVar35 = 0xe8;
          lVar38 = 0xa8;
LAB_00111c32:
          *(double *)((long)(pBVar42->p_min).t._M_elems + lVar38) = dVar50;
          *(ulong *)((long)(pBVar42->p_min).t._M_elems + lVar35) = CONCAT44(uVar48,uVar46);
          *(double *)((long)(pBVar42->p_min).t._M_elems + lVar30) = dVar51;
          *(double *)((long)(pBVar42->p_min).t._M_elems + lVar27) = dVar52;
          *(double *)((long)(pBVar42->p_min).t._M_elems + lVar25) = dVar49;
        }
        else if (CVar2 == Position) {
          pdVar20 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                    super__Deque_impl_data._M_start._M_cur;
          uVar18 = ((long)pdVar20 -
                    (long)(inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                          _M_impl.super__Deque_impl_data._M_start._M_first >> 3) + uVar32;
          if (uVar18 < 0x40) {
            pdVar19 = pdVar20 + uVar32;
          }
          else {
            uVar34 = uVar18 >> 6 | 0xfc00000000000000;
            if (0 < (long)uVar18) {
              uVar34 = uVar18 >> 6;
            }
            pdVar19 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                      _M_impl.super__Deque_impl_data._M_start._M_node[uVar34] +
                      uVar18 + uVar34 * -0x40;
          }
          if (ABS(*pdVar19) == INFINITY) {
            pdVar20 = (inp->max_acceleration).data.
                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_start._M_cur;
            uVar18 = ((long)pdVar20 -
                      (long)(inp->max_acceleration).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_first >> 3) + uVar32;
            if (uVar18 < 0x40) {
              pdVar19 = pdVar20 + uVar32;
            }
            else {
              uVar34 = uVar18 >> 6 | 0xfc00000000000000;
              if (0 < (long)uVar18) {
                uVar34 = uVar18 >> 6;
              }
              pdVar19 = (inp->max_acceleration).data.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_node[uVar34] + uVar18 + uVar34 * -0x40;
            }
            if (ABS(*pdVar19) != INFINITY) {
              pdVar19 = (inp->current_velocity).data.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_cur;
              uVar34 = ((long)pdVar19 -
                        (long)(inp->current_velocity).data.
                              super__Deque_base<double,_std::allocator<double>_>._M_impl.
                              super__Deque_impl_data._M_start._M_first >> 3) + uVar32;
              if (uVar34 < 0x40) {
                pdVar43 = pdVar19 + uVar32;
              }
              else {
                uVar40 = uVar34 >> 6 | 0xfc00000000000000;
                if (0 < (long)uVar34) {
                  uVar40 = uVar34 >> 6;
                }
                pdVar43 = (inp->current_velocity).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_node[uVar40] + uVar34 + uVar40 * -0x40;
              }
              pdVar19 = (inp->max_velocity).data.super__Deque_base<double,_std::allocator<double>_>.
                        _M_impl.super__Deque_impl_data._M_start._M_cur;
              uVar34 = ((long)pdVar19 -
                        (long)(inp->max_velocity).data.
                              super__Deque_base<double,_std::allocator<double>_>._M_impl.
                              super__Deque_impl_data._M_start._M_first >> 3) + uVar32;
              if (uVar34 < 0x40) {
                pdVar22 = pdVar19 + uVar32;
              }
              else {
                uVar40 = uVar34 >> 6 | 0xfc00000000000000;
                if (0 < (long)uVar34) {
                  uVar40 = uVar34 >> 6;
                }
                pdVar22 = (inp->max_velocity).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_node[uVar40] + uVar34 + uVar40 * -0x40;
              }
              if (uVar18 < 0x40) {
                pdVar31 = pdVar20 + uVar32;
              }
              else {
                uVar34 = uVar18 >> 6 | 0xfc00000000000000;
                if (0 < (long)uVar18) {
                  uVar34 = uVar18 >> 6;
                }
                pdVar31 = (inp->max_acceleration).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_node[uVar34] + uVar18 + uVar34 * -0x40;
              }
              ruckig::BrakeProfile::get_second_order_position_brake_trajectory
                        (*pdVar43,*pdVar22,pdVar6[uVar32],*pdVar31,dVar51);
            }
          }
          else {
            pdVar19 = (inp->current_velocity).data.
                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_start._M_cur;
            uVar34 = ((long)pdVar19 -
                      (long)(inp->current_velocity).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_first >> 3) + uVar32;
            if (uVar34 < 0x40) {
              pdVar43 = pdVar19 + uVar32;
            }
            else {
              uVar40 = uVar34 >> 6 | 0xfc00000000000000;
              if (0 < (long)uVar34) {
                uVar40 = uVar34 >> 6;
              }
              pdVar43 = (inp->current_velocity).data.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_node[uVar40] + uVar34 + uVar40 * -0x40;
            }
            pdVar19 = (inp->current_acceleration).data.
                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_start._M_cur;
            uVar34 = ((long)pdVar19 -
                      (long)(inp->current_acceleration).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_first >> 3) + uVar32;
            if (uVar34 < 0x40) {
              pdVar22 = pdVar19 + uVar32;
            }
            else {
              uVar40 = uVar34 >> 6 | 0xfc00000000000000;
              if (0 < (long)uVar34) {
                uVar40 = uVar34 >> 6;
              }
              pdVar22 = (inp->current_acceleration).data.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_node[uVar40] + uVar34 + uVar40 * -0x40;
            }
            pdVar19 = (inp->max_velocity).data.super__Deque_base<double,_std::allocator<double>_>.
                      _M_impl.super__Deque_impl_data._M_start._M_cur;
            uVar34 = ((long)pdVar19 -
                      (long)(inp->max_velocity).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_first >> 3) + uVar32;
            if (uVar34 < 0x40) {
              pdVar31 = pdVar19 + uVar32;
            }
            else {
              uVar40 = uVar34 >> 6 | 0xfc00000000000000;
              if (0 < (long)uVar34) {
                uVar40 = uVar34 >> 6;
              }
              pdVar31 = (inp->max_velocity).data.super__Deque_base<double,_std::allocator<double>_>.
                        _M_impl.super__Deque_impl_data._M_start._M_node[uVar40] +
                        uVar34 + uVar40 * -0x40;
            }
            pdVar19 = (inp->max_acceleration).data.
                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_start._M_cur;
            uVar34 = ((long)pdVar19 -
                      (long)(inp->max_acceleration).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_first >> 3) + uVar32;
            if (uVar34 < 0x40) {
              pdVar24 = pdVar19 + uVar32;
            }
            else {
              uVar40 = uVar34 >> 6 | 0xfc00000000000000;
              if (0 < (long)uVar34) {
                uVar40 = uVar34 >> 6;
              }
              pdVar24 = (inp->max_acceleration).data.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_node[uVar40] + uVar34 + uVar40 * -0x40;
            }
            if (uVar18 < 0x40) {
              pdVar23 = pdVar20 + uVar32;
            }
            else {
              uVar34 = uVar18 >> 6 | 0xfc00000000000000;
              if (0 < (long)uVar18) {
                uVar34 = uVar18 >> 6;
              }
              pdVar23 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                        _M_impl.super__Deque_impl_data._M_start._M_node[uVar34] +
                        uVar18 + uVar34 * -0x40;
            }
            ruckig::BrakeProfile::get_position_brake_trajectory
                      (*pdVar43,*pdVar22,*pdVar31,pdVar6[uVar32],*pdVar24,dVar51,*pdVar23);
          }
          pdVar20 = (inp->current_position).data.super__Deque_base<double,_std::allocator<double>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur;
          uVar18 = ((long)pdVar20 -
                    (long)(inp->current_position).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_first >> 3) + uVar32;
          if (uVar18 < 0x40) {
            pdVar20 = pdVar20 + uVar32;
          }
          else {
            uVar34 = uVar18 >> 6 | 0xfc00000000000000;
            if (0 < (long)uVar18) {
              uVar34 = uVar18 >> 6;
            }
            pdVar20 = (inp->current_position).data.
                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_start._M_node[uVar34] + uVar18 + uVar34 * -0x40;
          }
          pdVar19 = (inp->current_velocity).data.super__Deque_base<double,_std::allocator<double>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur;
          uVar46 = SUB84(*pdVar20,0);
          uVar48 = (undefined4)((ulong)*pdVar20 >> 0x20);
          uVar18 = ((long)pdVar19 -
                    (long)(inp->current_velocity).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_first >> 3) + uVar32;
          if (uVar18 < 0x40) {
            pdVar43 = pdVar19 + uVar32;
          }
          else {
            uVar34 = uVar18 >> 6 | 0xfc00000000000000;
            if (0 < (long)uVar18) {
              uVar34 = uVar18 >> 6;
            }
            pdVar43 = (inp->current_velocity).data.
                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_start._M_node[uVar34] + uVar18 + uVar34 * -0x40;
          }
          pdVar20 = (inp->current_acceleration).data.
                    super__Deque_base<double,_std::allocator<double>_>._M_impl.
                    super__Deque_impl_data._M_start._M_cur;
          dVar50 = *pdVar43;
          uVar18 = ((long)pdVar20 -
                    (long)(inp->current_acceleration).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_first >> 3) + uVar32;
          if (uVar18 < 0x40) {
            pdVar20 = pdVar20 + uVar32;
          }
          else {
            uVar34 = uVar18 >> 6 | 0xfc00000000000000;
            if (0 < (long)uVar18) {
              uVar34 = uVar18 >> 6;
            }
            pdVar20 = (inp->current_acceleration).data.
                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_start._M_node[uVar34] + uVar18 + uVar34 * -0x40;
          }
          pdVar19 = (inp->target_position).data.super__Deque_base<double,_std::allocator<double>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur;
          uVar18 = ((long)pdVar19 -
                    (long)(inp->target_position).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_first >> 3) + uVar32;
          if (uVar18 < 0x40) {
            pdVar43 = pdVar19 + uVar32;
          }
          else {
            uVar34 = uVar18 >> 6 | 0xfc00000000000000;
            if (0 < (long)uVar18) {
              uVar34 = uVar18 >> 6;
            }
            pdVar43 = (inp->target_position).data.super__Deque_base<double,_std::allocator<double>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_node[uVar34] +
                      uVar18 + uVar34 * -0x40;
          }
          pdVar19 = (inp->target_velocity).data.super__Deque_base<double,_std::allocator<double>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur;
          dVar49 = *pdVar43;
          uVar18 = ((long)pdVar19 -
                    (long)(inp->target_velocity).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_first >> 3) + uVar32;
          if (uVar18 < 0x40) {
            pdVar43 = pdVar19 + uVar32;
          }
          else {
            uVar34 = uVar18 >> 6 | 0xfc00000000000000;
            if (0 < (long)uVar18) {
              uVar34 = uVar18 >> 6;
            }
            pdVar43 = (inp->target_velocity).data.super__Deque_base<double,_std::allocator<double>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_node[uVar34] +
                      uVar18 + uVar34 * -0x40;
          }
          pdVar19 = (inp->target_acceleration).data.
                    super__Deque_base<double,_std::allocator<double>_>._M_impl.
                    super__Deque_impl_data._M_start._M_cur;
          dVar52 = *pdVar43;
          uVar18 = ((long)pdVar19 -
                    (long)(inp->target_acceleration).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_first >> 3) + uVar32;
          if (uVar18 < 0x40) {
            pdVar43 = pdVar19 + uVar32;
          }
          else {
            uVar34 = uVar18 >> 6 | 0xfc00000000000000;
            if (0 < (long)uVar18) {
              uVar34 = uVar18 >> 6;
            }
            pdVar43 = (inp->target_acceleration).data.
                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_start._M_node[uVar34] + uVar18 + uVar34 * -0x40;
          }
          dVar51 = *pdVar43;
          (pBVar42->p_min).a._M_elems[0] = *pdVar20;
          lVar25 = 0x218;
          lVar27 = 0x220;
          lVar30 = 0x228;
          lVar35 = 0x128;
          lVar38 = 0xe8;
          goto LAB_00111c32;
        }
        pdVar20 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                  super__Deque_impl_data._M_start._M_cur;
        uVar18 = ((long)pdVar20 -
                  (long)(inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                        _M_impl.super__Deque_impl_data._M_start._M_first >> 3) + uVar32;
        if (uVar18 < 0x40) {
          pdVar20 = pdVar20 + uVar32;
        }
        else {
          uVar34 = uVar18 >> 6 | 0xfc00000000000000;
          if (0 < (long)uVar18) {
            uVar34 = uVar18 >> 6;
          }
          pdVar20 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                    super__Deque_impl_data._M_start._M_node[uVar34] + uVar18 + uVar34 * -0x40;
        }
        if (ABS(*pdVar20) == INFINITY) {
          pdVar20 = (inp->max_acceleration).data.super__Deque_base<double,_std::allocator<double>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur;
          uVar18 = ((long)pdVar20 -
                    (long)(inp->max_acceleration).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_first >> 3) + uVar32;
          if (uVar18 < 0x40) {
            pdVar20 = pdVar20 + uVar32;
          }
          else {
            uVar34 = uVar18 >> 6 | 0xfc00000000000000;
            if (0 < (long)uVar18) {
              uVar34 = uVar18 >> 6;
            }
            pdVar20 = (inp->max_acceleration).data.
                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_start._M_node[uVar34] + uVar18 + uVar34 * -0x40;
          }
          if (ABS(*pdVar20) != INFINITY) {
            BrakeProfile::finalize_second_order
                      (&(pBVar42->p_min).brake,(pBVar42->p_min).p._M_elems,
                       (pBVar42->p_min).v._M_elems,(pBVar42->p_min).a._M_elems);
          }
        }
        else {
          BrakeProfile::finalize
                    (&(pBVar42->p_min).brake,(pBVar42->p_min).p._M_elems,(pBVar42->p_min).v._M_elems
                     ,(pBVar42->p_min).a._M_elems);
        }
        CVar2 = (this->inp_per_dof_control_interface).
                super__Vector_base<ruckig::ControlInterface,_std::allocator<ruckig::ControlInterface>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar32];
        if (CVar2 == Velocity) {
          pdVar20 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                    super__Deque_impl_data._M_start._M_cur;
          uVar18 = ((long)pdVar20 -
                    (long)(inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                          _M_impl.super__Deque_impl_data._M_start._M_first >> 3) + uVar32;
          if (uVar18 < 0x40) {
            pdVar19 = pdVar20 + uVar32;
          }
          else {
            uVar34 = uVar18 >> 6 | 0xfc00000000000000;
            if (0 < (long)uVar18) {
              uVar34 = uVar18 >> 6;
            }
            pdVar19 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                      _M_impl.super__Deque_impl_data._M_start._M_node[uVar34] +
                      uVar18 + uVar34 * -0x40;
          }
          if (ABS(*pdVar19) == INFINITY) {
            pdVar20 = (inp->max_acceleration).data.
                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_start._M_cur;
            uVar18 = ((long)pdVar20 -
                      (long)(inp->max_acceleration).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_first >> 3) + uVar32;
            if (uVar18 < 0x40) {
              pdVar43 = pdVar20 + uVar32;
            }
            else {
              uVar34 = uVar18 >> 6 | 0xfc00000000000000;
              if (0 < (long)uVar18) {
                uVar34 = uVar18 >> 6;
              }
              pdVar43 = (inp->max_acceleration).data.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_node[uVar34] + uVar18 + uVar34 * -0x40;
            }
            ruckig::VelocitySecondOrderStep1::VelocitySecondOrderStep1
                      ((VelocitySecondOrderStep1 *)local_e48,(pBVar42->p_min).v._M_elems[0],
                       (pBVar42->p_min).vf,*pdVar43,
                       (this->inp_min_acceleration).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar32]);
            cVar14 = ruckig::VelocitySecondOrderStep1::get_profile(local_e48,pBVar42);
          }
          else {
            pdVar19 = (inp->max_acceleration).data.
                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_start._M_cur;
            uVar34 = ((long)pdVar19 -
                      (long)(inp->max_acceleration).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_first >> 3) + uVar32;
            if (uVar34 < 0x40) {
              pdVar43 = pdVar19 + uVar32;
            }
            else {
              uVar40 = uVar34 >> 6 | 0xfc00000000000000;
              if (0 < (long)uVar34) {
                uVar40 = uVar34 >> 6;
              }
              pdVar43 = (inp->max_acceleration).data.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_node[uVar40] + uVar34 + uVar40 * -0x40;
            }
            if (uVar18 < 0x40) {
              pdVar22 = pdVar20 + uVar32;
            }
            else {
              uVar34 = uVar18 >> 6 | 0xfc00000000000000;
              if (0 < (long)uVar18) {
                uVar34 = uVar18 >> 6;
              }
              pdVar22 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                        _M_impl.super__Deque_impl_data._M_start._M_node[uVar34] +
                        uVar18 + uVar34 * -0x40;
            }
            ruckig::VelocityThirdOrderStep1::VelocityThirdOrderStep1
                      ((VelocityThirdOrderStep1 *)local_e48,(pBVar42->p_min).v._M_elems[0],
                       (pBVar42->p_min).a._M_elems[0],(pBVar42->p_min).vf,(pBVar42->p_min).af,
                       *pdVar43,(this->inp_min_acceleration).
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar32],*pdVar22);
            cVar14 = ruckig::VelocityThirdOrderStep1::get_profile(local_e48,pBVar42);
          }
LAB_001123f8:
          if (cVar14 != '\0') {
            pdVar20 = (traj->independent_min_durations).data.
                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_start._M_cur;
            uVar18 = ((long)pdVar20 -
                      (long)(traj->independent_min_durations).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_first >> 3) + uVar32;
            if (uVar18 < 0x40) {
              pdVar20 = pdVar20 + uVar32;
            }
            else {
              uVar34 = uVar18 >> 6 | 0xfc00000000000000;
              if (0 < (long)uVar18) {
                uVar34 = uVar18 >> 6;
              }
              pdVar20 = (traj->independent_min_durations).data.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_node[uVar34] + uVar18 + uVar34 * -0x40;
            }
            *pdVar20 = (this->blocks).
                       super__Vector_base<ruckig::Block,_std::allocator<ruckig::Block>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar32].t_min;
            bVar15 = false;
            goto LAB_0011257c;
          }
        }
        else if (CVar2 == Position) {
          pdVar20 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                    super__Deque_impl_data._M_start._M_cur;
          uVar18 = ((long)pdVar20 -
                    (long)(inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                          _M_impl.super__Deque_impl_data._M_start._M_first >> 3) + uVar32;
          if (uVar18 < 0x40) {
            pdVar19 = pdVar20 + uVar32;
          }
          else {
            uVar34 = uVar18 >> 6 | 0xfc00000000000000;
            if (0 < (long)uVar18) {
              uVar34 = uVar18 >> 6;
            }
            pdVar19 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                      _M_impl.super__Deque_impl_data._M_start._M_node[uVar34] +
                      uVar18 + uVar34 * -0x40;
          }
          if (ABS(*pdVar19) == INFINITY) {
            pdVar20 = (inp->max_acceleration).data.
                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_start._M_cur;
            uVar18 = ((long)pdVar20 -
                      (long)(inp->max_acceleration).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_first >> 3) + uVar32;
            if (uVar18 < 0x40) {
              pdVar19 = pdVar20 + uVar32;
            }
            else {
              uVar34 = uVar18 >> 6 | 0xfc00000000000000;
              if (0 < (long)uVar18) {
                uVar34 = uVar18 >> 6;
              }
              pdVar19 = (inp->max_acceleration).data.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_node[uVar34] + uVar18 + uVar34 * -0x40;
            }
            if (ABS(*pdVar19) == INFINITY) {
              pdVar20 = (inp->max_velocity).data.super__Deque_base<double,_std::allocator<double>_>.
                        _M_impl.super__Deque_impl_data._M_start._M_cur;
              uVar18 = ((long)pdVar20 -
                        (long)(inp->max_velocity).data.
                              super__Deque_base<double,_std::allocator<double>_>._M_impl.
                              super__Deque_impl_data._M_start._M_first >> 3) + uVar32;
              if (uVar18 < 0x40) {
                pdVar43 = pdVar20 + uVar32;
              }
              else {
                uVar34 = uVar18 >> 6 | 0xfc00000000000000;
                if (0 < (long)uVar18) {
                  uVar34 = uVar18 >> 6;
                }
                pdVar43 = (inp->max_velocity).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_node[uVar34] + uVar18 + uVar34 * -0x40;
              }
              ruckig::PositionFirstOrderStep1::PositionFirstOrderStep1
                        ((PositionFirstOrderStep1 *)local_e48,(pBVar42->p_min).p._M_elems[0],
                         (pBVar42->p_min).pf,*pdVar43,
                         (this->inp_min_velocity).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar32]);
              cVar14 = ruckig::PositionFirstOrderStep1::get_profile(local_e48,pBVar42);
            }
            else {
              pdVar19 = (inp->max_velocity).data.super__Deque_base<double,_std::allocator<double>_>.
                        _M_impl.super__Deque_impl_data._M_start._M_cur;
              uVar34 = ((long)pdVar19 -
                        (long)(inp->max_velocity).data.
                              super__Deque_base<double,_std::allocator<double>_>._M_impl.
                              super__Deque_impl_data._M_start._M_first >> 3) + uVar32;
              if (uVar34 < 0x40) {
                pdVar43 = pdVar19 + uVar32;
              }
              else {
                uVar40 = uVar34 >> 6 | 0xfc00000000000000;
                if (0 < (long)uVar34) {
                  uVar40 = uVar34 >> 6;
                }
                pdVar43 = (inp->max_velocity).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_node[uVar40] + uVar34 + uVar40 * -0x40;
              }
              if (uVar18 < 0x40) {
                pdVar22 = pdVar20 + uVar32;
              }
              else {
                uVar34 = uVar18 >> 6 | 0xfc00000000000000;
                if (0 < (long)uVar18) {
                  uVar34 = uVar18 >> 6;
                }
                pdVar22 = (inp->max_acceleration).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_node[uVar34] + uVar18 + uVar34 * -0x40;
              }
              ruckig::PositionSecondOrderStep1::PositionSecondOrderStep1
                        ((PositionSecondOrderStep1 *)local_e48,(pBVar42->p_min).p._M_elems[0],
                         (pBVar42->p_min).v._M_elems[0],(pBVar42->p_min).pf,(pBVar42->p_min).vf,
                         *pdVar43,(this->inp_min_velocity).
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start[uVar32],*pdVar22,
                         (this->inp_min_acceleration).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar32]);
              cVar14 = ruckig::PositionSecondOrderStep1::get_profile(local_e48,pBVar42);
            }
          }
          else {
            pdVar19 = (inp->max_velocity).data.super__Deque_base<double,_std::allocator<double>_>.
                      _M_impl.super__Deque_impl_data._M_start._M_cur;
            uVar34 = ((long)pdVar19 -
                      (long)(inp->max_velocity).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_first >> 3) + uVar32;
            if (uVar34 < 0x40) {
              pdVar43 = pdVar19 + uVar32;
            }
            else {
              uVar40 = uVar34 >> 6 | 0xfc00000000000000;
              if (0 < (long)uVar34) {
                uVar40 = uVar34 >> 6;
              }
              pdVar43 = (inp->max_velocity).data.super__Deque_base<double,_std::allocator<double>_>.
                        _M_impl.super__Deque_impl_data._M_start._M_node[uVar40] +
                        uVar34 + uVar40 * -0x40;
            }
            pdVar19 = (inp->max_acceleration).data.
                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_start._M_cur;
            uVar34 = ((long)pdVar19 -
                      (long)(inp->max_acceleration).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_first >> 3) + uVar32;
            if (uVar34 < 0x40) {
              pdVar22 = pdVar19 + uVar32;
            }
            else {
              uVar40 = uVar34 >> 6 | 0xfc00000000000000;
              if (0 < (long)uVar34) {
                uVar40 = uVar34 >> 6;
              }
              pdVar22 = (inp->max_acceleration).data.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_node[uVar40] + uVar34 + uVar40 * -0x40;
            }
            if (uVar18 < 0x40) {
              pdVar31 = pdVar20 + uVar32;
            }
            else {
              uVar34 = uVar18 >> 6 | 0xfc00000000000000;
              if (0 < (long)uVar18) {
                uVar34 = uVar18 >> 6;
              }
              pdVar31 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                        _M_impl.super__Deque_impl_data._M_start._M_node[uVar34] +
                        uVar18 + uVar34 * -0x40;
            }
            ruckig::PositionThirdOrderStep1::PositionThirdOrderStep1
                      ((PositionThirdOrderStep1 *)local_e48,(pBVar42->p_min).p._M_elems[0],
                       (pBVar42->p_min).v._M_elems[0],(pBVar42->p_min).a._M_elems[0],
                       (pBVar42->p_min).pf,(pBVar42->p_min).vf,(pBVar42->p_min).af,*pdVar43,
                       (this->inp_min_velocity).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar32],*pdVar22,
                       (this->inp_min_acceleration).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar32],*pdVar31);
            cVar14 = ruckig::PositionThirdOrderStep1::get_profile(local_e48,pBVar42);
          }
          goto LAB_001123f8;
        }
        pdVar20 = (inp->max_acceleration).data.super__Deque_base<double,_std::allocator<double>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur;
        uVar18 = ((long)pdVar20 -
                  (long)(inp->max_acceleration).data.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_first >> 3) + uVar32;
        if (uVar18 < 0x40) {
          pdVar43 = pdVar20 + uVar32;
        }
        else {
          uVar34 = uVar18 >> 6 | 0xfc00000000000000;
          if (0 < (long)uVar18) {
            uVar34 = uVar18 >> 6;
          }
          pdVar43 = (inp->max_acceleration).data.super__Deque_base<double,_std::allocator<double>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_node[uVar34] +
                    uVar18 + uVar34 * -0x40;
        }
        local_e74 = ErrorZeroLimits;
        bVar15 = true;
        if (((*pdVar43 != 0.0) || (NAN(*pdVar43))) &&
           ((dVar51 = (this->inp_min_acceleration).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar32], dVar51 != 0.0 || (NAN(dVar51))))) {
          pdVar20 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                    super__Deque_impl_data._M_start._M_cur;
          uVar18 = ((long)pdVar20 -
                    (long)(inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                          _M_impl.super__Deque_impl_data._M_start._M_first >> 3) + uVar32;
          if (uVar18 < 0x40) {
            pdVar43 = pdVar20 + uVar32;
          }
          else {
            uVar34 = uVar18 >> 6 | 0xfc00000000000000;
            if (0 < (long)uVar18) {
              uVar34 = uVar18 >> 6;
            }
            pdVar43 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                      _M_impl.super__Deque_impl_data._M_start._M_node[uVar34] +
                      uVar18 + uVar34 * -0x40;
          }
          local_e74 = ErrorZeroLimits;
          if (*pdVar43 != 0.0) {
            local_e74 = ErrorExecutionTimeCalculation;
          }
          if (NAN(*pdVar43)) {
            local_e74 = ErrorExecutionTimeCalculation;
          }
        }
      }
LAB_0011257c:
      if (bVar15) break;
      uVar32 = uVar32 + 1;
      bVar45 = uVar32 < this->degrees_of_freedom;
    } while (bVar45);
  }
  if (bVar45) {
    return local_e74;
  }
  DVar3 = inp->duration_discretization;
  if ((this->degrees_of_freedom == 1 &&
      ((inp->minimum_duration).super__Optional_base<double,_true,_true>._M_payload.
       super__Optional_payload_base<double>._M_engaged & 1U) == 0) && DVar3 != Discrete) {
    pBVar37 = (this->blocks).super__Vector_base<ruckig::Block,_std::allocator<ruckig::Block>_>.
              _M_impl.super__Vector_impl_data._M_start;
    traj->duration = pBVar37->t_min;
    pMVar5 = (traj->profiles).
             super__Vector_base<MinimalDynamicDofsVector<ruckig::Profile,_0UL>,_std::allocator<MinimalDynamicDofsVector<ruckig::Profile,_0UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pPVar36 = ((iterator *)
              ((long)&(pMVar5->data).
                      super__Deque_base<ruckig::Profile,_std::allocator<ruckig::Profile>_> + 0x10))
              ->_M_cur;
    lVar25 = (long)pPVar36 -
             (long)*(_Elt_pointer *)
                    ((long)&(pMVar5->data).
                            super__Deque_base<ruckig::Profile,_std::allocator<ruckig::Profile>_> +
                    0x18);
    if (lVar25 != 0) {
      pPVar36 = *(_Elt_pointer *)
                 ((long)*(_Map_pointer *)
                         ((long)&(pMVar5->data).
                                 super__Deque_base<ruckig::Profile,_std::allocator<ruckig::Profile>_>
                         + 0x28) + (lVar25 >> 3) * -0x71c71c71c71c71c7);
    }
    memcpy(pPVar36,pBVar37,0x23c);
    *(traj->cumulative_times).super__Vector_base<double,_std::allocator<double>_>._M_impl.
     super__Vector_impl_data._M_start = traj->duration;
    return Working;
  }
  local_e58 = '\0';
  poVar1 = &inp->minimum_duration;
  pdVar43 = &traj->duration;
  uVar10 = (poVar1->super__Optional_base<double,_true,_true>)._M_payload.
           super__Optional_payload_base<double>._M_payload;
  uVar11 = (poVar1->super__Optional_base<double,_true,_true>)._M_payload.
           super__Optional_payload_base<double>._M_engaged;
  uVar12 = *(undefined3 *)
            &(poVar1->super__Optional_base<double,_true,_true>)._M_payload.
             super__Optional_payload_base<double>.field_0x9;
  t_min.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _9_3_ = uVar12;
  t_min.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _M_engaged = (bool)uVar11;
  t_min.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _M_payload = (_Storage<double,_true>)uVar10;
  t_min.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _12_4_ = 0;
  bVar45 = synchronize(this,t_min,pdVar43,(optional<unsigned_long> *)&local_e60,
                       (traj->profiles).
                       super__Vector_base<MinimalDynamicDofsVector<ruckig::Profile,_0UL>,_std::allocator<MinimalDynamicDofsVector<ruckig::Profile,_0UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,DVar3 == Discrete,delta_time);
  sVar7 = this->degrees_of_freedom;
  if (!bVar45) {
    if (sVar7 != 0) {
      pdVar20 = (inp->max_acceleration).data.super__Deque_base<double,_std::allocator<double>_>.
                _M_impl.super__Deque_impl_data._M_start._M_cur;
      lVar27 = (long)pdVar20 -
               (long)(inp->max_acceleration).data.super__Deque_base<double,_std::allocator<double>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_first;
      lVar30 = lVar27 >> 3;
      pdVar19 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur;
      lVar35 = (long)pdVar19 -
               (long)(inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>._M_impl
                     .super__Deque_impl_data._M_start._M_first;
      lVar25 = lVar35 >> 3;
      sVar44 = 0;
      do {
        uVar32 = lVar30 + sVar44;
        if (uVar32 < 0x40) {
          pdVar43 = pdVar20 + sVar44;
        }
        else {
          uVar18 = uVar32 >> 6 | 0xfc00000000000000;
          if (0 < (long)uVar32) {
            uVar18 = uVar32 >> 6;
          }
          pdVar43 = (double *)
                    ((long)(inp->max_acceleration).data.
                           super__Deque_base<double,_std::allocator<double>_>._M_impl.
                           super__Deque_impl_data._M_start._M_node[uVar18] +
                    lVar27 + uVar18 * -0x200);
        }
        if ((*pdVar43 == 0.0) && (!NAN(*pdVar43))) {
          return ErrorZeroLimits;
        }
        dVar51 = (this->inp_min_acceleration).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[sVar44];
        if ((dVar51 == 0.0) && (!NAN(dVar51))) {
          return ErrorZeroLimits;
        }
        uVar32 = lVar25 + sVar44;
        if (uVar32 < 0x40) {
          pdVar43 = pdVar19 + sVar44;
        }
        else {
          uVar18 = uVar32 >> 6 | 0xfc00000000000000;
          if (0 < (long)uVar32) {
            uVar18 = uVar32 >> 6;
          }
          pdVar43 = (double *)
                    ((long)(inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                           _M_impl.super__Deque_impl_data._M_start._M_node[uVar18] +
                    lVar35 + uVar18 * -0x200);
        }
        if ((*pdVar43 == 0.0) && (!NAN(*pdVar43))) {
          return ErrorZeroLimits;
        }
        sVar44 = sVar44 + 1;
        lVar27 = lVar27 + 8;
        lVar35 = lVar35 + 8;
      } while (sVar7 != sVar44);
    }
    return ErrorSynchronizationCalculation;
  }
  if (sVar7 != 0) {
    lVar27 = 0;
    lVar25 = 0;
    _Var41._M_value = 0;
    do {
      pbVar29 = (inp->enabled).data.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur;
      pbVar8 = (inp->enabled).data.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
               super__Deque_impl_data._M_start._M_first;
      pbVar33 = pbVar29 + (_Var41._M_value - (long)pbVar8);
      if ((_Elt_pointer)0x1ff < pbVar33) {
        uVar32 = (ulong)pbVar33 >> 9 | 0xff80000000000000;
        if (0 < (long)pbVar33) {
          uVar32 = (ulong)pbVar33 >> 9;
        }
        pbVar29 = (inp->enabled).data.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                  super__Deque_impl_data._M_start._M_node[uVar32] +
                  (long)(pbVar29 + (uVar32 * -0x200 - (long)pbVar8));
      }
      if ((pbVar29[_Var41._M_value] == true) &&
         ((this->inp_per_dof_synchronization).
          super__Vector_base<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>.
          _M_impl.super__Vector_impl_data._M_start[_Var41._M_value] == None)) {
        pMVar5 = (traj->profiles).
                 super__Vector_base<MinimalDynamicDofsVector<ruckig::Profile,_0UL>,_std::allocator<MinimalDynamicDofsVector<ruckig::Profile,_0UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pPVar36 = ((iterator *)
                  ((long)&(pMVar5->data).
                          super__Deque_base<ruckig::Profile,_std::allocator<ruckig::Profile>_> +
                  0x10))->_M_cur;
        lVar30 = ((long)pPVar36 -
                  (long)*(_Elt_pointer *)
                         ((long)&(pMVar5->data).
                                 super__Deque_base<ruckig::Profile,_std::allocator<ruckig::Profile>_>
                         + 0x18) >> 6) * -0x71c71c71c71c71c7 + _Var41._M_value;
        if (lVar30 == 0) {
          pPVar39 = (Profile *)((long)&pPVar36->t + lVar25);
        }
        else {
          pPVar39 = (*(_Map_pointer *)
                      ((long)&(pMVar5->data).
                              super__Deque_base<ruckig::Profile,_std::allocator<ruckig::Profile>_> +
                      0x28))[lVar30];
        }
        memcpy(pPVar39,(void *)((long)(((this->blocks).
                                        super__Vector_base<ruckig::Block,_std::allocator<ruckig::Block>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->p_min).t.
                                      _M_elems + lVar27),0x23c);
        dVar51 = *(double *)
                  ((long)&((this->blocks).
                           super__Vector_base<ruckig::Block,_std::allocator<ruckig::Block>_>._M_impl
                           .super__Vector_impl_data._M_start)->t_min + lVar27);
        if (*pdVar43 <= dVar51 && dVar51 != *pdVar43) {
          *pdVar43 = dVar51;
          local_e58 = '\x01';
          local_e60 = _Var41;
        }
      }
      _Var41._M_value = _Var41._M_value + 1;
      lVar25 = lVar25 + 0x240;
      lVar27 = lVar27 + 0x6f8;
    } while (_Var41._M_value < this->degrees_of_freedom);
  }
  *(traj->cumulative_times).super__Vector_base<double,_std::allocator<double>_>._M_impl.
   super__Vector_impl_data._M_start = traj->duration;
  dVar51 = traj->duration;
  if (7600.0 < dVar51) {
    return ErrorTrajectoryDuration;
  }
  if ((dVar51 == 0.0) && (!NAN(dVar51))) {
    if (this->degrees_of_freedom == 0) {
      return Working;
    }
    lVar25 = 0;
    lVar27 = 0;
    uVar32 = 0;
    do {
      pMVar5 = (traj->profiles).
               super__Vector_base<MinimalDynamicDofsVector<ruckig::Profile,_0UL>,_std::allocator<MinimalDynamicDofsVector<ruckig::Profile,_0UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pPVar36 = ((iterator *)
                ((long)&(pMVar5->data).
                        super__Deque_base<ruckig::Profile,_std::allocator<ruckig::Profile>_> + 0x10)
                )->_M_cur;
      lVar30 = ((long)pPVar36 -
                (long)*(_Elt_pointer *)
                       ((long)&(pMVar5->data).
                               super__Deque_base<ruckig::Profile,_std::allocator<ruckig::Profile>_>
                       + 0x18) >> 6) * -0x71c71c71c71c71c7 + uVar32;
      if (lVar30 == 0) {
        pPVar39 = (Profile *)((long)&pPVar36->t + lVar25);
      }
      else {
        pPVar39 = (*(_Map_pointer *)
                    ((long)&(pMVar5->data).
                            super__Deque_base<ruckig::Profile,_std::allocator<ruckig::Profile>_> +
                    0x28))[lVar30];
      }
      memcpy(pPVar39,(void *)((long)(((this->blocks).
                                      super__Vector_base<ruckig::Block,_std::allocator<ruckig::Block>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->p_min).t._M_elems
                             + lVar27),0x23c);
      uVar32 = uVar32 + 1;
      lVar27 = lVar27 + 0x6f8;
      lVar25 = lVar25 + 0x240;
    } while (uVar32 < this->degrees_of_freedom);
    return Working;
  }
  if ((DVar3 != Discrete) &&
     (pSVar28 = (this->inp_per_dof_synchronization).
                super__Vector_base<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>
                ._M_impl.super__Vector_impl_data._M_finish,
     _Var21 = std::
              __find_if<__gnu_cxx::__normal_iterator<ruckig::Synchronization*,std::vector<ruckig::Synchronization,std::allocator<ruckig::Synchronization>>>,__gnu_cxx::__ops::_Iter_negate<ruckig::TargetCalculator<0ul,MinimalDynamicDofsVector>::calculate<false>(ruckig::InputParameter<0ul,MinimalDynamicDofsVector>const&,ruckig::Trajectory<0ul,MinimalDynamicDofsVector>&,double,bool&)::_lambda(ruckig::Synchronization)_1_>>
                        ((this->inp_per_dof_synchronization).
                         super__Vector_base<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>
                         ._M_impl.super__Vector_impl_data._M_start,pSVar28),
     _Var21._M_current == pSVar28)) {
    return Working;
  }
  if ((local_e58 != '\x01') ||
     (pSVar28 = (this->inp_per_dof_synchronization).
                super__Vector_base<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>
                ._M_impl.super__Vector_impl_data._M_finish,
     _Var21 = std::
              __find_if<__gnu_cxx::__normal_iterator<ruckig::Synchronization*,std::vector<ruckig::Synchronization,std::allocator<ruckig::Synchronization>>>,__gnu_cxx::__ops::_Iter_pred<ruckig::TargetCalculator<0ul,MinimalDynamicDofsVector>::calculate<false>(ruckig::InputParameter<0ul,MinimalDynamicDofsVector>const&,ruckig::Trajectory<0ul,MinimalDynamicDofsVector>&,double,bool&)::_lambda(ruckig::Synchronization)_2_>>
                        ((this->inp_per_dof_synchronization).
                         super__Vector_base<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>
                         ._M_impl.super__Vector_impl_data._M_start,pSVar28),
     _Var21._M_current == pSVar28)) goto LAB_00113ec2;
  if (local_e58 == '\0') {
    std::__throw_bad_optional_access();
  }
  pMVar5 = (traj->profiles).
           super__Vector_base<MinimalDynamicDofsVector<ruckig::Profile,_0UL>,_std::allocator<MinimalDynamicDofsVector<ruckig::Profile,_0UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar36 = ((iterator *)
            ((long)&(pMVar5->data).
                    super__Deque_base<ruckig::Profile,_std::allocator<ruckig::Profile>_> + 0x10))->
            _M_cur;
  lVar25 = ((long)pPVar36 -
            (long)*(_Elt_pointer *)
                   ((long)&(pMVar5->data).
                           super__Deque_base<ruckig::Profile,_std::allocator<ruckig::Profile>_> +
                   0x18) >> 6) * -0x71c71c71c71c71c7 + local_e60._M_value;
  if (lVar25 == 0) {
    pPVar36 = pPVar36 + (long)local_e60;
  }
  else {
    pPVar36 = (*(_Map_pointer *)
                ((long)&(pMVar5->data).
                        super__Deque_base<ruckig::Profile,_std::allocator<ruckig::Profile>_> + 0x28)
              )[lVar25];
  }
  bVar15 = is_input_collinear(this,inp,pPVar36->direction,local_e60._M_value);
  bVar45 = true;
  if (bVar15) {
    if (this->degrees_of_freedom != 0) {
      bVar16 = 1;
      lVar25 = 0;
      lVar27 = 0;
      uVar32 = 0;
      do {
        pbVar29 = (inp->enabled).data.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                  super__Deque_impl_data._M_start._M_cur;
        pbVar8 = (inp->enabled).data.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                 super__Deque_impl_data._M_start._M_first;
        pbVar33 = pbVar29 + (uVar32 - (long)pbVar8);
        if ((_Elt_pointer)0x1ff < pbVar33) {
          uVar18 = (ulong)pbVar33 >> 9 | 0xff80000000000000;
          if (0 < (long)pbVar33) {
            uVar18 = (ulong)pbVar33 >> 9;
          }
          pbVar29 = (inp->enabled).data.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                    super__Deque_impl_data._M_start._M_node[uVar18] +
                    (long)(pbVar29 + (uVar18 * -0x200 - (long)pbVar8));
        }
        if ((pbVar29[uVar32] == true) &&
           (((local_e58 != '\x01' || (uVar32 != local_e60._M_value)) &&
            ((this->inp_per_dof_synchronization).
             super__Vector_base<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar32] == Phase)))) {
          pMVar5 = (traj->profiles).
                   super__Vector_base<MinimalDynamicDofsVector<ruckig::Profile,_0UL>,_std::allocator<MinimalDynamicDofsVector<ruckig::Profile,_0UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pPVar9 = ((iterator *)
                   ((long)&(pMVar5->data).
                           super__Deque_base<ruckig::Profile,_std::allocator<ruckig::Profile>_> +
                   0x10))->_M_cur;
          lVar30 = ((long)pPVar9 -
                    (long)*(_Elt_pointer *)
                           ((long)&(pMVar5->data).
                                   super__Deque_base<ruckig::Profile,_std::allocator<ruckig::Profile>_>
                           + 0x18) >> 6) * -0x71c71c71c71c71c7 + uVar32;
          if (lVar30 == 0) {
            pPVar39 = (Profile *)((long)&pPVar9->t + lVar25);
          }
          else {
            pPVar39 = (*(_Map_pointer *)
                        ((long)&(pMVar5->data).
                                super__Deque_base<ruckig::Profile,_std::allocator<ruckig::Profile>_>
                        + 0x28))[lVar30];
          }
          (pPVar39->t)._M_elems[6] = *(double *)((long)(pPVar36->t)._M_elems + 0x30);
          dVar51 = (pPVar36->t)._M_elems[0];
          dVar50 = *(double *)((long)(pPVar36->t)._M_elems + 8);
          dVar49 = *(double *)((long)(pPVar36->t)._M_elems + 0x10);
          dVar52 = *(double *)((long)(pPVar36->t)._M_elems + 0x18);
          dVar13 = *(double *)((long)(pPVar36->t)._M_elems + 0x28);
          (pPVar39->t)._M_elems[4] = *(double *)((long)(pPVar36->t)._M_elems + 0x20);
          (pPVar39->t)._M_elems[5] = dVar13;
          (pPVar39->t)._M_elems[2] = dVar49;
          (pPVar39->t)._M_elems[3] = dVar52;
          (pPVar39->t)._M_elems[0] = dVar51;
          (pPVar39->t)._M_elems[1] = dVar50;
          CVar4 = pPVar36->control_signs;
          pPVar39->control_signs = CVar4;
          CVar2 = (this->inp_per_dof_control_interface).
                  super__Vector_base<ruckig::ControlInterface,_std::allocator<ruckig::ControlInterface>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar32];
          if (CVar2 == Velocity) {
            if (CVar4 == UDUD) {
              pdVar20 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                        _M_impl.super__Deque_impl_data._M_start._M_cur;
              lVar30 = (long)pdVar20 -
                       (long)(inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_first >> 3;
              uVar18 = lVar30 + uVar32;
              if (uVar18 < 0x40) {
                pdVar22 = (double *)((long)pdVar20 + lVar27);
              }
              else {
                uVar34 = uVar18 >> 6 | 0xfc00000000000000;
                if (0 < (long)uVar18) {
                  uVar34 = uVar18 >> 6;
                }
                pdVar22 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                          _M_impl.super__Deque_impl_data._M_start._M_node[uVar34] +
                          lVar30 + uVar34 * -0x40 + uVar32;
              }
              if (ABS(*pdVar22) != INFINITY) {
                pdVar19 = (this->new_phase_control).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur;
                lVar35 = (long)pdVar19 -
                         (long)(this->new_phase_control).data.
                               super__Deque_base<double,_std::allocator<double>_>._M_impl.
                               super__Deque_impl_data._M_start._M_first >> 3;
                uVar34 = lVar35 + uVar32;
                if (uVar34 < 0x40) {
                  pdVar22 = (double *)((long)pdVar19 + lVar27);
                }
                else {
                  uVar40 = uVar34 >> 6 | 0xfc00000000000000;
                  if (0 < (long)uVar34) {
                    uVar40 = uVar34 >> 6;
                  }
                  pdVar22 = (this->new_phase_control).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_node[uVar40] +
                            lVar35 + uVar40 * -0x40 + uVar32;
                }
                pdVar19 = (inp->max_acceleration).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur;
                lVar35 = (long)pdVar19 -
                         (long)(inp->max_acceleration).data.
                               super__Deque_base<double,_std::allocator<double>_>._M_impl.
                               super__Deque_impl_data._M_start._M_first >> 3;
                uVar34 = lVar35 + uVar32;
                if (uVar34 < 0x40) {
                  pdVar31 = (double *)((long)pdVar19 + lVar27);
                }
                else {
                  local_e50 = (inp->max_acceleration).data.
                              super__Deque_base<double,_std::allocator<double>_>._M_impl.
                              super__Deque_impl_data._M_start._M_node;
                  uVar40 = uVar34 >> 6 | 0xfc00000000000000;
                  if (0 < (long)uVar34) {
                    uVar40 = uVar34 >> 6;
                  }
                  pdVar31 = local_e50[uVar40] + lVar35 + uVar40 * -0x40 + uVar32;
                }
                if (uVar18 < 0x40) {
                  pdVar24 = (double *)((long)pdVar20 + lVar27);
                }
                else {
                  uVar34 = uVar18 >> 6 | 0xfc00000000000000;
                  if (0 < (long)uVar18) {
                    uVar34 = uVar18 >> 6;
                  }
                  pdVar24 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                            _M_impl.super__Deque_impl_data._M_start._M_node[uVar34] +
                            lVar30 + uVar34 * -0x40 + uVar32;
                }
                if (ABS(*pdVar24) + 1e-12 <= ABS(*pdVar22)) {
LAB_00113b09:
                  bVar45 = false;
                }
                else {
                  bVar45 = Profile::
                           check_for_velocity<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7>
                                     (pPVar39,*pdVar22,*pdVar31,
                                      (this->inp_min_acceleration).
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start[uVar32]);
                }
                goto LAB_00113b24;
              }
              pdVar20 = (this->new_phase_control).data.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_cur;
              lVar30 = (long)pdVar20 -
                       (long)(this->new_phase_control).data.
                             super__Deque_base<double,_std::allocator<double>_>._M_impl.
                             super__Deque_impl_data._M_start._M_first >> 3;
              uVar18 = lVar30 + uVar32;
              if (uVar18 < 0x40) {
                pdVar22 = (double *)((long)pdVar20 + lVar27);
              }
              else {
                uVar34 = uVar18 >> 6 | 0xfc00000000000000;
                if (0 < (long)uVar18) {
                  uVar34 = uVar18 >> 6;
                }
                pdVar22 = (this->new_phase_control).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_node[uVar34] +
                          lVar30 + uVar34 * -0x40 + uVar32;
              }
              pdVar20 = (inp->max_acceleration).data.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_cur;
              lVar30 = (long)pdVar20 -
                       (long)(inp->max_acceleration).data.
                             super__Deque_base<double,_std::allocator<double>_>._M_impl.
                             super__Deque_impl_data._M_start._M_first >> 3;
              uVar18 = lVar30 + uVar32;
              if (uVar18 < 0x40) {
                pdVar31 = (double *)((long)pdVar20 + lVar27);
              }
              else {
                uVar34 = uVar18 >> 6 | 0xfc00000000000000;
                if (0 < (long)uVar18) {
                  uVar34 = uVar18 >> 6;
                }
                pdVar31 = (inp->max_acceleration).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_node[uVar34] +
                          lVar30 + uVar34 * -0x40 + uVar32;
              }
              dVar51 = *pdVar22;
              bVar45 = false;
              if ((dVar51 < *pdVar31 + 1e-12) &&
                 ((this->inp_min_acceleration).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar32] + -1e-12 < dVar51)) {
                bVar45 = Profile::
                         check_for_second_order_velocity<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7>
                                   (pPVar39,dVar51);
              }
            }
            else {
              if (CVar4 != UDDU) goto LAB_00113b27;
              pdVar20 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                        _M_impl.super__Deque_impl_data._M_start._M_cur;
              lVar30 = (long)pdVar20 -
                       (long)(inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_first >> 3;
              uVar18 = lVar30 + uVar32;
              if (uVar18 < 0x40) {
                pdVar22 = (double *)((long)pdVar20 + lVar27);
              }
              else {
                uVar34 = uVar18 >> 6 | 0xfc00000000000000;
                if (0 < (long)uVar18) {
                  uVar34 = uVar18 >> 6;
                }
                pdVar22 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                          _M_impl.super__Deque_impl_data._M_start._M_node[uVar34] +
                          lVar30 + uVar34 * -0x40 + uVar32;
              }
              if (ABS(*pdVar22) != INFINITY) {
                pdVar19 = (this->new_phase_control).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur;
                lVar35 = (long)pdVar19 -
                         (long)(this->new_phase_control).data.
                               super__Deque_base<double,_std::allocator<double>_>._M_impl.
                               super__Deque_impl_data._M_start._M_first >> 3;
                uVar34 = lVar35 + uVar32;
                if (uVar34 < 0x40) {
                  pdVar22 = (double *)((long)pdVar19 + lVar27);
                }
                else {
                  uVar40 = uVar34 >> 6 | 0xfc00000000000000;
                  if (0 < (long)uVar34) {
                    uVar40 = uVar34 >> 6;
                  }
                  pdVar22 = (this->new_phase_control).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_node[uVar40] +
                            lVar35 + uVar40 * -0x40 + uVar32;
                }
                pdVar19 = (inp->max_acceleration).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur;
                lVar35 = (long)pdVar19 -
                         (long)(inp->max_acceleration).data.
                               super__Deque_base<double,_std::allocator<double>_>._M_impl.
                               super__Deque_impl_data._M_start._M_first >> 3;
                uVar34 = lVar35 + uVar32;
                if (uVar34 < 0x40) {
                  pdVar31 = (double *)((long)pdVar19 + lVar27);
                }
                else {
                  local_e50 = (inp->max_acceleration).data.
                              super__Deque_base<double,_std::allocator<double>_>._M_impl.
                              super__Deque_impl_data._M_start._M_node;
                  uVar40 = uVar34 >> 6 | 0xfc00000000000000;
                  if (0 < (long)uVar34) {
                    uVar40 = uVar34 >> 6;
                  }
                  pdVar31 = local_e50[uVar40] + lVar35 + uVar40 * -0x40 + uVar32;
                }
                if (uVar18 < 0x40) {
                  pdVar24 = (double *)((long)pdVar20 + lVar27);
                }
                else {
                  uVar34 = uVar18 >> 6 | 0xfc00000000000000;
                  if (0 < (long)uVar18) {
                    uVar34 = uVar18 >> 6;
                  }
                  pdVar24 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                            _M_impl.super__Deque_impl_data._M_start._M_node[uVar34] +
                            lVar30 + uVar34 * -0x40 + uVar32;
                }
                if (ABS(*pdVar24) + 1e-12 <= ABS(*pdVar22)) goto LAB_00113b09;
                bVar45 = Profile::
                         check_for_velocity<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                   (pPVar39,*pdVar22,*pdVar31,
                                    (this->inp_min_acceleration).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start[uVar32]);
                goto LAB_00113b24;
              }
              pdVar20 = (this->new_phase_control).data.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_cur;
              lVar30 = (long)pdVar20 -
                       (long)(this->new_phase_control).data.
                             super__Deque_base<double,_std::allocator<double>_>._M_impl.
                             super__Deque_impl_data._M_start._M_first >> 3;
              uVar18 = lVar30 + uVar32;
              if (uVar18 < 0x40) {
                pdVar22 = (double *)((long)pdVar20 + lVar27);
              }
              else {
                uVar34 = uVar18 >> 6 | 0xfc00000000000000;
                if (0 < (long)uVar18) {
                  uVar34 = uVar18 >> 6;
                }
                pdVar22 = (this->new_phase_control).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_node[uVar34] +
                          lVar30 + uVar34 * -0x40 + uVar32;
              }
              pdVar20 = (inp->max_acceleration).data.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_cur;
              lVar30 = (long)pdVar20 -
                       (long)(inp->max_acceleration).data.
                             super__Deque_base<double,_std::allocator<double>_>._M_impl.
                             super__Deque_impl_data._M_start._M_first >> 3;
              uVar18 = lVar30 + uVar32;
              if (uVar18 < 0x40) {
                pdVar31 = (double *)((long)pdVar20 + lVar27);
              }
              else {
                uVar34 = uVar18 >> 6 | 0xfc00000000000000;
                if (0 < (long)uVar18) {
                  uVar34 = uVar18 >> 6;
                }
                pdVar31 = (inp->max_acceleration).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_node[uVar34] +
                          lVar30 + uVar34 * -0x40 + uVar32;
              }
              dVar51 = *pdVar22;
              bVar45 = false;
              if ((dVar51 < *pdVar31 + 1e-12) &&
                 (bVar45 = false,
                 (this->inp_min_acceleration).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar32] + -1e-12 < dVar51)) {
                bVar45 = Profile::
                         check_for_second_order_velocity<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                   (pPVar39,dVar51);
              }
            }
LAB_001139fa:
            bVar16 = bVar16 & bVar45;
          }
          else if (CVar2 == Position) {
            if (CVar4 == UDUD) {
              pdVar20 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                        _M_impl.super__Deque_impl_data._M_start._M_cur;
              lVar30 = (long)pdVar20 -
                       (long)(inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_first >> 3;
              uVar18 = lVar30 + uVar32;
              if (uVar18 < 0x40) {
                pdVar22 = (double *)((long)pdVar20 + lVar27);
              }
              else {
                uVar34 = uVar18 >> 6 | 0xfc00000000000000;
                if (0 < (long)uVar18) {
                  uVar34 = uVar18 >> 6;
                }
                pdVar22 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                          _M_impl.super__Deque_impl_data._M_start._M_node[uVar34] +
                          lVar30 + uVar34 * -0x40 + uVar32;
              }
              if (ABS(*pdVar22) == INFINITY) {
                pdVar20 = (this->new_phase_control).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur;
                lVar30 = (long)pdVar20 -
                         (long)(this->new_phase_control).data.
                               super__Deque_base<double,_std::allocator<double>_>._M_impl.
                               super__Deque_impl_data._M_start._M_first >> 3;
                uVar18 = lVar30 + uVar32;
                if (uVar18 < 0x40) {
                  pdVar22 = (double *)((long)pdVar20 + lVar27);
                }
                else {
                  uVar34 = uVar18 >> 6 | 0xfc00000000000000;
                  if (0 < (long)uVar18) {
                    uVar34 = uVar18 >> 6;
                  }
                  pdVar22 = (this->new_phase_control).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_node[uVar34] +
                            lVar30 + uVar34 * -0x40 + uVar32;
                }
                if (uVar18 < 0x40) {
                  pdVar31 = (double *)((long)pdVar20 + lVar27);
                }
                else {
                  uVar34 = uVar18 >> 6 | 0xfc00000000000000;
                  if (0 < (long)uVar18) {
                    uVar34 = uVar18 >> 6;
                  }
                  pdVar31 = (this->new_phase_control).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_node[uVar34] +
                            lVar30 + uVar34 * -0x40 + uVar32;
                }
                pdVar20 = (inp->max_velocity).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur;
                lVar30 = (long)pdVar20 -
                         (long)(inp->max_velocity).data.
                               super__Deque_base<double,_std::allocator<double>_>._M_impl.
                               super__Deque_impl_data._M_start._M_first >> 3;
                uVar18 = lVar30 + uVar32;
                if (uVar18 < 0x40) {
                  pdVar24 = (double *)((long)pdVar20 + lVar27);
                }
                else {
                  uVar34 = uVar18 >> 6 | 0xfc00000000000000;
                  if (0 < (long)uVar18) {
                    uVar34 = uVar18 >> 6;
                  }
                  pdVar24 = (inp->max_velocity).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_node[uVar34] +
                            lVar30 + uVar34 * -0x40 + uVar32;
                }
                pdVar20 = (inp->max_acceleration).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur;
                lVar30 = (long)pdVar20 -
                         (long)(inp->max_acceleration).data.
                               super__Deque_base<double,_std::allocator<double>_>._M_impl.
                               super__Deque_impl_data._M_start._M_first >> 3;
                uVar18 = lVar30 + uVar32;
                if (uVar18 < 0x40) {
                  pdVar23 = (double *)((long)pdVar20 + lVar27);
                }
                else {
                  uVar34 = uVar18 >> 6 | 0xfc00000000000000;
                  if (0 < (long)uVar18) {
                    uVar34 = uVar18 >> 6;
                  }
                  pdVar23 = (inp->max_acceleration).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_node[uVar34] +
                            lVar30 + uVar34 * -0x40 + uVar32;
                }
                dVar51 = *pdVar22;
                dVar50 = (this->inp_min_acceleration).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar32] + -1e-12;
                if (dVar51 <= dVar50) {
                  bVar45 = false;
                }
                else {
                  dVar49 = -*pdVar31;
                  bVar45 = false;
                  if (((dVar49 < *pdVar23 + 1e-12) && (dVar50 < dVar49)) &&
                     (dVar51 < *pdVar23 + 1e-12)) {
                    bVar45 = Profile::
                             check_for_second_order<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7>
                                       (pPVar39,dVar51,dVar49,*pdVar24,
                                        (this->inp_min_velocity).
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start[uVar32]);
                  }
                }
              }
              else {
                pdVar19 = (this->new_phase_control).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur;
                lVar35 = (long)pdVar19 -
                         (long)(this->new_phase_control).data.
                               super__Deque_base<double,_std::allocator<double>_>._M_impl.
                               super__Deque_impl_data._M_start._M_first >> 3;
                uVar34 = lVar35 + uVar32;
                if (uVar34 < 0x40) {
                  pdVar22 = (double *)((long)pdVar19 + lVar27);
                }
                else {
                  uVar40 = uVar34 >> 6 | 0xfc00000000000000;
                  if (0 < (long)uVar34) {
                    uVar40 = uVar34 >> 6;
                  }
                  pdVar22 = (this->new_phase_control).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_node[uVar40] +
                            lVar35 + uVar40 * -0x40 + uVar32;
                }
                pdVar19 = (inp->max_velocity).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur;
                lVar35 = (long)pdVar19 -
                         (long)(inp->max_velocity).data.
                               super__Deque_base<double,_std::allocator<double>_>._M_impl.
                               super__Deque_impl_data._M_start._M_first >> 3;
                uVar34 = lVar35 + uVar32;
                if (uVar34 < 0x40) {
                  pdVar31 = (double *)((long)pdVar19 + lVar27);
                }
                else {
                  uVar40 = uVar34 >> 6 | 0xfc00000000000000;
                  if (0 < (long)uVar34) {
                    uVar40 = uVar34 >> 6;
                  }
                  pdVar31 = (inp->max_velocity).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_node[uVar40] +
                            lVar35 + uVar40 * -0x40 + uVar32;
                }
                pdVar19 = (inp->max_acceleration).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur;
                lVar35 = (long)pdVar19 -
                         (long)(inp->max_acceleration).data.
                               super__Deque_base<double,_std::allocator<double>_>._M_impl.
                               super__Deque_impl_data._M_start._M_first >> 3;
                uVar34 = lVar35 + uVar32;
                if (uVar34 < 0x40) {
                  pdVar24 = (double *)((long)pdVar19 + lVar27);
                }
                else {
                  uVar40 = uVar34 >> 6 | 0xfc00000000000000;
                  if (0 < (long)uVar34) {
                    uVar40 = uVar34 >> 6;
                  }
                  pdVar24 = (inp->max_acceleration).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_node[uVar40] +
                            lVar35 + uVar40 * -0x40 + uVar32;
                }
                if (uVar18 < 0x40) {
                  pdVar23 = (double *)((long)pdVar20 + lVar27);
                }
                else {
                  uVar34 = uVar18 >> 6 | 0xfc00000000000000;
                  if (0 < (long)uVar18) {
                    uVar34 = uVar18 >> 6;
                  }
                  pdVar23 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                            _M_impl.super__Deque_impl_data._M_start._M_node[uVar34] +
                            lVar30 + uVar34 * -0x40 + uVar32;
                }
                if (ABS(*pdVar23) + 1e-12 <= ABS(*pdVar22)) goto LAB_00113b09;
                bVar45 = Profile::
                         check<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7,false>
                                   (pPVar39,*pdVar22,*pdVar31,
                                    (this->inp_min_velocity).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start[uVar32],*pdVar24,
                                    (this->inp_min_acceleration).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start[uVar32]);
              }
LAB_00113b24:
              bVar16 = bVar16 & bVar45;
            }
            else if (CVar4 == UDDU) {
              pdVar20 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                        _M_impl.super__Deque_impl_data._M_start._M_cur;
              lVar30 = (long)pdVar20 -
                       (long)(inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_first >> 3;
              uVar18 = lVar30 + uVar32;
              if (uVar18 < 0x40) {
                pdVar22 = (double *)((long)pdVar20 + lVar27);
              }
              else {
                uVar34 = uVar18 >> 6 | 0xfc00000000000000;
                if (0 < (long)uVar18) {
                  uVar34 = uVar18 >> 6;
                }
                pdVar22 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                          _M_impl.super__Deque_impl_data._M_start._M_node[uVar34] +
                          lVar30 + uVar34 * -0x40 + uVar32;
              }
              if (ABS(*pdVar22) != INFINITY) {
                pdVar19 = (this->new_phase_control).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur;
                lVar35 = (long)pdVar19 -
                         (long)(this->new_phase_control).data.
                               super__Deque_base<double,_std::allocator<double>_>._M_impl.
                               super__Deque_impl_data._M_start._M_first >> 3;
                uVar34 = lVar35 + uVar32;
                if (uVar34 < 0x40) {
                  pdVar22 = (double *)((long)pdVar19 + lVar27);
                }
                else {
                  uVar40 = uVar34 >> 6 | 0xfc00000000000000;
                  if (0 < (long)uVar34) {
                    uVar40 = uVar34 >> 6;
                  }
                  pdVar22 = (this->new_phase_control).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_node[uVar40] +
                            lVar35 + uVar40 * -0x40 + uVar32;
                }
                pdVar19 = (inp->max_velocity).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur;
                lVar35 = (long)pdVar19 -
                         (long)(inp->max_velocity).data.
                               super__Deque_base<double,_std::allocator<double>_>._M_impl.
                               super__Deque_impl_data._M_start._M_first >> 3;
                uVar34 = lVar35 + uVar32;
                if (uVar34 < 0x40) {
                  pdVar31 = (double *)((long)pdVar19 + lVar27);
                }
                else {
                  uVar40 = uVar34 >> 6 | 0xfc00000000000000;
                  if (0 < (long)uVar34) {
                    uVar40 = uVar34 >> 6;
                  }
                  pdVar31 = (inp->max_velocity).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_node[uVar40] +
                            lVar35 + uVar40 * -0x40 + uVar32;
                }
                pdVar19 = (inp->max_acceleration).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur;
                lVar35 = (long)pdVar19 -
                         (long)(inp->max_acceleration).data.
                               super__Deque_base<double,_std::allocator<double>_>._M_impl.
                               super__Deque_impl_data._M_start._M_first >> 3;
                uVar34 = lVar35 + uVar32;
                if (uVar34 < 0x40) {
                  pdVar24 = (double *)((long)pdVar19 + lVar27);
                }
                else {
                  uVar40 = uVar34 >> 6 | 0xfc00000000000000;
                  if (0 < (long)uVar34) {
                    uVar40 = uVar34 >> 6;
                  }
                  pdVar24 = (inp->max_acceleration).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_node[uVar40] +
                            lVar35 + uVar40 * -0x40 + uVar32;
                }
                if (uVar18 < 0x40) {
                  pdVar23 = (double *)((long)pdVar20 + lVar27);
                }
                else {
                  uVar34 = uVar18 >> 6 | 0xfc00000000000000;
                  if (0 < (long)uVar18) {
                    uVar34 = uVar18 >> 6;
                  }
                  pdVar23 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                            _M_impl.super__Deque_impl_data._M_start._M_node[uVar34] +
                            lVar30 + uVar34 * -0x40 + uVar32;
                }
                if (ABS(*pdVar23) + 1e-12 <= ABS(*pdVar22)) goto LAB_00113b09;
                bVar45 = Profile::
                         check<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7,false>
                                   (pPVar39,*pdVar22,*pdVar31,
                                    (this->inp_min_velocity).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start[uVar32],*pdVar24,
                                    (this->inp_min_acceleration).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start[uVar32]);
                goto LAB_00113b24;
              }
              pdVar20 = (inp->max_acceleration).data.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_cur;
              lVar30 = (long)pdVar20 -
                       (long)(inp->max_acceleration).data.
                             super__Deque_base<double,_std::allocator<double>_>._M_impl.
                             super__Deque_impl_data._M_start._M_first >> 3;
              uVar18 = lVar30 + uVar32;
              if (uVar18 < 0x40) {
                pdVar22 = (double *)((long)pdVar20 + lVar27);
              }
              else {
                uVar34 = uVar18 >> 6 | 0xfc00000000000000;
                if (0 < (long)uVar18) {
                  uVar34 = uVar18 >> 6;
                }
                pdVar22 = (inp->max_acceleration).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_node[uVar34] +
                          lVar30 + uVar34 * -0x40 + uVar32;
              }
              if (ABS(*pdVar22) != INFINITY) {
                pdVar19 = (this->new_phase_control).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur;
                lVar35 = (long)pdVar19 -
                         (long)(this->new_phase_control).data.
                               super__Deque_base<double,_std::allocator<double>_>._M_impl.
                               super__Deque_impl_data._M_start._M_first >> 3;
                uVar34 = lVar35 + uVar32;
                if (uVar34 < 0x40) {
                  pdVar22 = (double *)((long)pdVar19 + lVar27);
                }
                else {
                  uVar40 = uVar34 >> 6 | 0xfc00000000000000;
                  if (0 < (long)uVar34) {
                    uVar40 = uVar34 >> 6;
                  }
                  pdVar22 = (this->new_phase_control).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_node[uVar40] +
                            lVar35 + uVar40 * -0x40 + uVar32;
                }
                if (uVar34 < 0x40) {
                  pdVar31 = (double *)((long)pdVar19 + lVar27);
                }
                else {
                  uVar40 = uVar34 >> 6 | 0xfc00000000000000;
                  if (0 < (long)uVar34) {
                    uVar40 = uVar34 >> 6;
                  }
                  pdVar31 = (this->new_phase_control).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_node[uVar40] +
                            lVar35 + uVar40 * -0x40 + uVar32;
                }
                pdVar19 = (inp->max_velocity).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur;
                lVar35 = (long)pdVar19 -
                         (long)(inp->max_velocity).data.
                               super__Deque_base<double,_std::allocator<double>_>._M_impl.
                               super__Deque_impl_data._M_start._M_first >> 3;
                uVar34 = lVar35 + uVar32;
                if (uVar34 < 0x40) {
                  pdVar24 = (double *)((long)pdVar19 + lVar27);
                }
                else {
                  uVar40 = uVar34 >> 6 | 0xfc00000000000000;
                  if (0 < (long)uVar34) {
                    uVar40 = uVar34 >> 6;
                  }
                  pdVar24 = (inp->max_velocity).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_node[uVar40] +
                            lVar35 + uVar40 * -0x40 + uVar32;
                }
                if (uVar18 < 0x40) {
                  pdVar23 = (double *)((long)pdVar20 + lVar27);
                }
                else {
                  uVar34 = uVar18 >> 6 | 0xfc00000000000000;
                  if (0 < (long)uVar18) {
                    uVar34 = uVar18 >> 6;
                  }
                  pdVar23 = (inp->max_acceleration).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_node[uVar34] +
                            lVar30 + uVar34 * -0x40 + uVar32;
                }
                dVar51 = *pdVar22;
                dVar50 = (this->inp_min_acceleration).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar32] + -1e-12;
                if (dVar50 < dVar51) {
                  dVar49 = -*pdVar31;
                  bVar45 = false;
                  if ((dVar49 < *pdVar23 + 1e-12) && (dVar50 < dVar49)) {
                    if (dVar51 < *pdVar23 + 1e-12) {
                      bVar45 = Profile::
                               check_for_second_order<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                         (pPVar39,dVar51,dVar49,*pdVar24,
                                          (this->inp_min_velocity).
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start[uVar32]);
                    }
                    goto LAB_001139fa;
                  }
                }
                bVar45 = false;
                goto LAB_001139fa;
              }
              pdVar20 = (this->new_phase_control).data.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_cur;
              lVar30 = (long)pdVar20 -
                       (long)(this->new_phase_control).data.
                             super__Deque_base<double,_std::allocator<double>_>._M_impl.
                             super__Deque_impl_data._M_start._M_first >> 3;
              uVar18 = lVar30 + uVar32;
              if (uVar18 < 0x40) {
                pdVar22 = (double *)((long)pdVar20 + lVar27);
              }
              else {
                uVar34 = uVar18 >> 6 | 0xfc00000000000000;
                if (0 < (long)uVar18) {
                  uVar34 = uVar18 >> 6;
                }
                pdVar22 = (this->new_phase_control).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_node[uVar34] +
                          lVar30 + uVar34 * -0x40 + uVar32;
              }
              pdVar20 = (inp->max_velocity).data.super__Deque_base<double,_std::allocator<double>_>.
                        _M_impl.super__Deque_impl_data._M_start._M_cur;
              lVar30 = (long)pdVar20 -
                       (long)(inp->max_velocity).data.
                             super__Deque_base<double,_std::allocator<double>_>._M_impl.
                             super__Deque_impl_data._M_start._M_first >> 3;
              uVar18 = lVar30 + uVar32;
              if (uVar18 < 0x40) {
                pdVar31 = (double *)((long)pdVar20 + lVar27);
              }
              else {
                uVar34 = uVar18 >> 6 | 0xfc00000000000000;
                if (0 < (long)uVar18) {
                  uVar34 = uVar18 >> 6;
                }
                pdVar31 = (inp->max_velocity).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_node[uVar34] +
                          lVar30 + uVar34 * -0x40 + uVar32;
              }
              dVar51 = *pdVar22;
              bVar45 = false;
              if ((dVar51 < *pdVar31 + 1e-12) &&
                 (bVar45 = false,
                 (this->inp_min_velocity).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar32] + -1e-12 < dVar51)) {
                bVar45 = Profile::
                         check_for_first_order<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                   (pPVar39,dVar51);
              }
              bVar16 = bVar45 & bVar16;
            }
          }
LAB_00113b27:
          pPVar39->limits = pPVar36->limits;
        }
        uVar32 = uVar32 + 1;
        lVar27 = lVar27 + 8;
        lVar25 = lVar25 + 0x240;
      } while (uVar32 < this->degrees_of_freedom);
      bVar45 = true;
      if (bVar16 == 0) goto LAB_00113eb2;
    }
    bVar45 = true;
    pSVar28 = (this->inp_per_dof_synchronization).
              super__Vector_base<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    _Var21 = std::
             __find_if<__gnu_cxx::__normal_iterator<ruckig::Synchronization*,std::vector<ruckig::Synchronization,std::allocator<ruckig::Synchronization>>>,__gnu_cxx::__ops::_Iter_negate<ruckig::TargetCalculator<0ul,MinimalDynamicDofsVector>::calculate<false>(ruckig::InputParameter<0ul,MinimalDynamicDofsVector>const&,ruckig::Trajectory<0ul,MinimalDynamicDofsVector>&,double,bool&)::_lambda(ruckig::Synchronization)_3_>>
                       ((this->inp_per_dof_synchronization).
                        super__Vector_base<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>
                        ._M_impl.super__Vector_impl_data._M_start,pSVar28);
    if (_Var21._M_current == pSVar28) {
      bVar45 = false;
      local_e74 = Working;
    }
  }
LAB_00113eb2:
  if (!bVar45) {
    return local_e74;
  }
LAB_00113ec2:
  if (this->degrees_of_freedom == 0) {
    return Working;
  }
  lVar27 = 0;
  lVar25 = 0;
  lVar30 = 0;
  uVar32 = 0;
  do {
    if (((local_e58 == '\x01') && (uVar32 == local_e60._M_value)) ||
       (bVar45 = true,
       (this->inp_per_dof_synchronization).
       super__Vector_base<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>._M_impl
       .super__Vector_impl_data._M_start[uVar32] == None)) {
      bVar45 = DVar3 == Discrete;
    }
    pbVar33 = (inp->enabled).data.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur;
    pbVar29 = pbVar33 + (uVar32 - (long)(inp->enabled).data.
                                        super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                                        super__Deque_impl_data._M_start._M_first);
    if (pbVar29 < (_Elt_pointer)0x200) {
      pbVar33 = pbVar33 + uVar32;
    }
    else {
      uVar18 = (ulong)pbVar29 >> 9 | 0xff80000000000000;
      if (0 < (long)pbVar29) {
        uVar18 = (ulong)pbVar29 >> 9;
      }
      pbVar33 = (inp->enabled).data.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                super__Deque_impl_data._M_start._M_node[uVar18] + (long)(pbVar29 + uVar18 * -0x200);
    }
    bVar16 = 0x18;
    if ((bVar45 & *pbVar33) == 1) {
      pMVar5 = (traj->profiles).
               super__Vector_base<MinimalDynamicDofsVector<ruckig::Profile,_0UL>,_std::allocator<MinimalDynamicDofsVector<ruckig::Profile,_0UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pPVar36 = ((iterator *)
                ((long)&(pMVar5->data).
                        super__Deque_base<ruckig::Profile,_std::allocator<ruckig::Profile>_> + 0x10)
                )->_M_cur;
      lVar35 = ((long)pPVar36 -
                (long)*(_Elt_pointer *)
                       ((long)&(pMVar5->data).
                               super__Deque_base<ruckig::Profile,_std::allocator<ruckig::Profile>_>
                       + 0x18) >> 6) * -0x71c71c71c71c71c7 + uVar32;
      if (lVar35 == 0) {
        pPVar39 = (Profile *)((long)&pPVar36->t + lVar30);
      }
      else {
        pPVar39 = (*(_Map_pointer *)
                    ((long)&(pMVar5->data).
                            super__Deque_base<ruckig::Profile,_std::allocator<ruckig::Profile>_> +
                    0x28))[lVar35];
      }
      dVar51 = (*pdVar43 - (pPVar39->brake).duration) - (pPVar39->accel).duration;
      if ((this->inp_per_dof_synchronization).
          super__Vector_base<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar32] == TimeIfNecessary) {
        pdVar20 = (inp->target_velocity).data.super__Deque_base<double,_std::allocator<double>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur;
        lVar35 = (long)pdVar20 -
                 (long)(inp->target_velocity).data.
                       super__Deque_base<double,_std::allocator<double>_>._M_impl.
                       super__Deque_impl_data._M_start._M_first >> 3;
        uVar18 = lVar35 + uVar32;
        if (uVar18 < 0x40) {
          pdVar22 = (double *)((long)pdVar20 + lVar25);
        }
        else {
          uVar34 = uVar18 >> 6 | 0xfc00000000000000;
          if (0 < (long)uVar18) {
            uVar34 = uVar18 >> 6;
          }
          pdVar22 = (inp->target_velocity).data.super__Deque_base<double,_std::allocator<double>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_node[uVar34] +
                    lVar35 + uVar34 * -0x40 + uVar32;
        }
        if (2.220446049250313e-16 <= ABS(*pdVar22)) goto LAB_001140df;
        pdVar20 = (inp->target_acceleration).data.super__Deque_base<double,_std::allocator<double>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur;
        lVar35 = (long)pdVar20 -
                 (long)(inp->target_acceleration).data.
                       super__Deque_base<double,_std::allocator<double>_>._M_impl.
                       super__Deque_impl_data._M_start._M_first >> 3;
        uVar18 = lVar35 + uVar32;
        if (uVar18 < 0x40) {
          pdVar22 = (double *)((long)pdVar20 + lVar25);
        }
        else {
          uVar34 = uVar18 >> 6 | 0xfc00000000000000;
          if (0 < (long)uVar18) {
            uVar34 = uVar18 >> 6;
          }
          pdVar22 = (inp->target_acceleration).data.
                    super__Deque_base<double,_std::allocator<double>_>._M_impl.
                    super__Deque_impl_data._M_start._M_node[uVar34] +
                    lVar35 + uVar34 * -0x40 + uVar32;
        }
        if (2.220446049250313e-16 <= ABS(*pdVar22)) goto LAB_001140df;
        pBVar37 = (this->blocks).super__Vector_base<ruckig::Block,_std::allocator<ruckig::Block>_>.
                  _M_impl.super__Vector_impl_data._M_start;
LAB_0011410e:
        __src = (void *)((long)(pBVar37->p_min).t._M_elems + lVar27);
      }
      else {
LAB_001140df:
        pBVar37 = (this->blocks).super__Vector_base<ruckig::Block,_std::allocator<ruckig::Block>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (ABS(dVar51 - *(double *)((long)&pBVar37->t_min + lVar27)) < 4.440892098500626e-16)
        goto LAB_0011410e;
        if ((*(char *)((long)&(pBVar37->a).super__Optional_base<ruckig::Block::Interval,_true,_true>
                              ._M_payload + lVar27 + 0x250) != '\x01') ||
           (4.440892098500626e-16 <=
            ABS(dVar51 - *(double *)
                          ((long)&(pBVar37->a).
                                  super__Optional_base<ruckig::Block::Interval,_true,_true>.
                                  _M_payload + lVar27 + 8)))) {
          if ((*(char *)((long)&(pBVar37->b).
                                super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload
                        + lVar27 + 0x250) != '\x01') ||
             (4.440892098500626e-16 <=
              ABS(dVar51 - *(double *)
                            ((long)&(pBVar37->b).
                                    super__Optional_base<ruckig::Block::Interval,_true,_true>.
                                    _M_payload + lVar27 + 8)))) {
            CVar2 = (this->inp_per_dof_control_interface).
                    super__Vector_base<ruckig::ControlInterface,_std::allocator<ruckig::ControlInterface>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar32];
            if (CVar2 == Velocity) {
              pdVar20 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                        _M_impl.super__Deque_impl_data._M_start._M_cur;
              lVar35 = (long)pdVar20 -
                       (long)(inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_first >> 3;
              uVar18 = lVar35 + uVar32;
              if (uVar18 < 0x40) {
                pdVar22 = (double *)((long)pdVar20 + lVar25);
              }
              else {
                uVar34 = uVar18 >> 6 | 0xfc00000000000000;
                if (0 < (long)uVar18) {
                  uVar34 = uVar18 >> 6;
                }
                pdVar22 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                          _M_impl.super__Deque_impl_data._M_start._M_node[uVar34] +
                          lVar35 + uVar34 * -0x40 + uVar32;
              }
              if (ABS(*pdVar22) == INFINITY) {
                pdVar20 = (inp->max_acceleration).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur;
                lVar35 = (long)pdVar20 -
                         (long)(inp->max_acceleration).data.
                               super__Deque_base<double,_std::allocator<double>_>._M_impl.
                               super__Deque_impl_data._M_start._M_first >> 3;
                uVar18 = lVar35 + uVar32;
                if (uVar18 < 0x40) {
                  pdVar22 = (double *)((long)pdVar20 + lVar25);
                }
                else {
                  uVar34 = uVar18 >> 6 | 0xfc00000000000000;
                  if (0 < (long)uVar18) {
                    uVar34 = uVar18 >> 6;
                  }
                  pdVar22 = (inp->max_acceleration).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_node[uVar34] +
                            lVar35 + uVar34 * -0x40 + uVar32;
                }
                ruckig::VelocitySecondOrderStep2::VelocitySecondOrderStep2
                          ((VelocitySecondOrderStep2 *)local_e48,dVar51,(pPVar39->v)._M_elems[0],
                           pPVar39->vf,*pdVar22,
                           (this->inp_min_acceleration).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar32]);
                bVar17 = ruckig::VelocitySecondOrderStep2::get_profile(local_e48);
              }
              else {
                pdVar19 = (inp->max_acceleration).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur;
                lVar38 = (long)pdVar19 -
                         (long)(inp->max_acceleration).data.
                               super__Deque_base<double,_std::allocator<double>_>._M_impl.
                               super__Deque_impl_data._M_start._M_first >> 3;
                uVar34 = lVar38 + uVar32;
                if (uVar34 < 0x40) {
                  pdVar22 = (double *)((long)pdVar19 + lVar25);
                }
                else {
                  uVar40 = uVar34 >> 6 | 0xfc00000000000000;
                  if (0 < (long)uVar34) {
                    uVar40 = uVar34 >> 6;
                  }
                  pdVar22 = (inp->max_acceleration).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_node[uVar40] +
                            lVar38 + uVar40 * -0x40 + uVar32;
                }
                if (uVar18 < 0x40) {
                  pdVar31 = (double *)((long)pdVar20 + lVar25);
                }
                else {
                  uVar34 = uVar18 >> 6 | 0xfc00000000000000;
                  if (0 < (long)uVar18) {
                    uVar34 = uVar18 >> 6;
                  }
                  pdVar31 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                            _M_impl.super__Deque_impl_data._M_start._M_node[uVar34] +
                            lVar35 + uVar34 * -0x40 + uVar32;
                }
                ruckig::VelocityThirdOrderStep2::VelocityThirdOrderStep2
                          ((VelocityThirdOrderStep2 *)local_e48,dVar51,(pPVar39->v)._M_elems[0],
                           (pPVar39->a)._M_elems[0],pPVar39->vf,pPVar39->af,*pdVar22,
                           (this->inp_min_acceleration).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar32],*pdVar31);
                bVar17 = ruckig::VelocityThirdOrderStep2::get_profile(local_e48);
              }
            }
            else if (CVar2 == Position) {
              pdVar20 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                        _M_impl.super__Deque_impl_data._M_start._M_cur;
              lVar35 = (long)pdVar20 -
                       (long)(inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_first >> 3;
              uVar18 = lVar35 + uVar32;
              if (uVar18 < 0x40) {
                pdVar22 = (double *)((long)pdVar20 + lVar25);
              }
              else {
                uVar34 = uVar18 >> 6 | 0xfc00000000000000;
                if (0 < (long)uVar18) {
                  uVar34 = uVar18 >> 6;
                }
                pdVar22 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                          _M_impl.super__Deque_impl_data._M_start._M_node[uVar34] +
                          lVar35 + uVar34 * -0x40 + uVar32;
              }
              if (ABS(*pdVar22) == INFINITY) {
                pdVar20 = (inp->max_acceleration).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur;
                lVar35 = (long)pdVar20 -
                         (long)(inp->max_acceleration).data.
                               super__Deque_base<double,_std::allocator<double>_>._M_impl.
                               super__Deque_impl_data._M_start._M_first >> 3;
                uVar18 = lVar35 + uVar32;
                if (uVar18 < 0x40) {
                  pdVar22 = (double *)((long)pdVar20 + lVar25);
                }
                else {
                  uVar34 = uVar18 >> 6 | 0xfc00000000000000;
                  if (0 < (long)uVar18) {
                    uVar34 = uVar18 >> 6;
                  }
                  pdVar22 = (inp->max_acceleration).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_node[uVar34] +
                            lVar35 + uVar34 * -0x40 + uVar32;
                }
                if (ABS(*pdVar22) == INFINITY) {
                  pdVar20 = (inp->max_velocity).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_cur;
                  lVar35 = (long)pdVar20 -
                           (long)(inp->max_velocity).data.
                                 super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                 super__Deque_impl_data._M_start._M_first >> 3;
                  uVar18 = lVar35 + uVar32;
                  if (uVar18 < 0x40) {
                    pdVar22 = (double *)((long)pdVar20 + lVar25);
                  }
                  else {
                    uVar34 = uVar18 >> 6 | 0xfc00000000000000;
                    if (0 < (long)uVar18) {
                      uVar34 = uVar18 >> 6;
                    }
                    pdVar22 = (inp->max_velocity).data.
                              super__Deque_base<double,_std::allocator<double>_>._M_impl.
                              super__Deque_impl_data._M_start._M_node[uVar34] +
                              lVar35 + uVar34 * -0x40 + uVar32;
                  }
                  ruckig::PositionFirstOrderStep2::PositionFirstOrderStep2
                            ((PositionFirstOrderStep2 *)local_e48,dVar51,(pPVar39->p)._M_elems[0],
                             pPVar39->pf,*pdVar22,
                             (this->inp_min_velocity).
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar32]);
                  bVar17 = ruckig::PositionFirstOrderStep2::get_profile(local_e48);
                }
                else {
                  pdVar19 = (inp->max_velocity).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_cur;
                  lVar38 = (long)pdVar19 -
                           (long)(inp->max_velocity).data.
                                 super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                 super__Deque_impl_data._M_start._M_first >> 3;
                  uVar34 = lVar38 + uVar32;
                  if (uVar34 < 0x40) {
                    pdVar22 = (double *)((long)pdVar19 + lVar25);
                  }
                  else {
                    uVar40 = uVar34 >> 6 | 0xfc00000000000000;
                    if (0 < (long)uVar34) {
                      uVar40 = uVar34 >> 6;
                    }
                    pdVar22 = (inp->max_velocity).data.
                              super__Deque_base<double,_std::allocator<double>_>._M_impl.
                              super__Deque_impl_data._M_start._M_node[uVar40] +
                              lVar38 + uVar40 * -0x40 + uVar32;
                  }
                  if (uVar18 < 0x40) {
                    pdVar31 = (double *)((long)pdVar20 + lVar25);
                  }
                  else {
                    uVar34 = uVar18 >> 6 | 0xfc00000000000000;
                    if (0 < (long)uVar18) {
                      uVar34 = uVar18 >> 6;
                    }
                    pdVar31 = (inp->max_acceleration).data.
                              super__Deque_base<double,_std::allocator<double>_>._M_impl.
                              super__Deque_impl_data._M_start._M_node[uVar34] +
                              lVar35 + uVar34 * -0x40 + uVar32;
                  }
                  ruckig::PositionSecondOrderStep2::PositionSecondOrderStep2
                            ((PositionSecondOrderStep2 *)local_e48,dVar51,(pPVar39->p)._M_elems[0],
                             (pPVar39->v)._M_elems[0],pPVar39->pf,pPVar39->vf,*pdVar22,
                             (this->inp_min_velocity).
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar32],*pdVar31,
                             (this->inp_min_acceleration).
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar32]);
                  bVar17 = ruckig::PositionSecondOrderStep2::get_profile(local_e48);
                }
              }
              else {
                pdVar19 = (inp->max_velocity).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur;
                lVar38 = (long)pdVar19 -
                         (long)(inp->max_velocity).data.
                               super__Deque_base<double,_std::allocator<double>_>._M_impl.
                               super__Deque_impl_data._M_start._M_first >> 3;
                uVar34 = lVar38 + uVar32;
                if (uVar34 < 0x40) {
                  pdVar22 = (double *)((long)pdVar19 + lVar25);
                }
                else {
                  uVar40 = uVar34 >> 6 | 0xfc00000000000000;
                  if (0 < (long)uVar34) {
                    uVar40 = uVar34 >> 6;
                  }
                  pdVar22 = (inp->max_velocity).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_node[uVar40] +
                            lVar38 + uVar40 * -0x40 + uVar32;
                }
                pdVar19 = (inp->max_acceleration).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur;
                lVar38 = (long)pdVar19 -
                         (long)(inp->max_acceleration).data.
                               super__Deque_base<double,_std::allocator<double>_>._M_impl.
                               super__Deque_impl_data._M_start._M_first >> 3;
                uVar34 = lVar38 + uVar32;
                if (uVar34 < 0x40) {
                  pdVar31 = (double *)((long)pdVar19 + lVar25);
                }
                else {
                  uVar40 = uVar34 >> 6 | 0xfc00000000000000;
                  if (0 < (long)uVar34) {
                    uVar40 = uVar34 >> 6;
                  }
                  pdVar31 = (inp->max_acceleration).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_node[uVar40] +
                            lVar38 + uVar40 * -0x40 + uVar32;
                }
                if (uVar18 < 0x40) {
                  pdVar24 = (double *)((long)pdVar20 + lVar25);
                }
                else {
                  uVar34 = uVar18 >> 6 | 0xfc00000000000000;
                  if (0 < (long)uVar18) {
                    uVar34 = uVar18 >> 6;
                  }
                  pdVar24 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                            _M_impl.super__Deque_impl_data._M_start._M_node[uVar34] +
                            lVar35 + uVar34 * -0x40 + uVar32;
                }
                ruckig::PositionThirdOrderStep2::PositionThirdOrderStep2
                          ((PositionThirdOrderStep2 *)local_e48,dVar51,(pPVar39->p)._M_elems[0],
                           (pPVar39->v)._M_elems[0],(pPVar39->a)._M_elems[0],pPVar39->pf,pPVar39->vf
                           ,pPVar39->af,*pdVar22,
                           (this->inp_min_velocity).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar32],*pdVar31,
                           (this->inp_min_acceleration).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar32],*pdVar24);
                bVar17 = ruckig::PositionThirdOrderStep2::get_profile(local_e48);
              }
            }
            else {
              bVar17 = 0;
            }
            bVar16 = bVar17 ^ 1;
            if (bVar17 == 0) {
              local_e74 = ErrorSynchronizationCalculation;
            }
            goto LAB_001148b6;
          }
          __src = (void *)((long)&(pBVar37->b).
                                  super__Optional_base<ruckig::Block::Interval,_true,_true>.
                                  _M_payload + lVar27 + 0x10);
        }
        else {
          __src = (void *)((long)&(pBVar37->a).
                                  super__Optional_base<ruckig::Block::Interval,_true,_true>.
                                  _M_payload + lVar27 + 0x10);
        }
      }
      memcpy(pPVar39,__src,0x23c);
    }
LAB_001148b6:
    if ((bVar16 != 0x18) && (bVar16 != 0)) {
      return local_e74;
    }
    uVar32 = uVar32 + 1;
    lVar30 = lVar30 + 0x240;
    lVar25 = lVar25 + 8;
    lVar27 = lVar27 + 0x6f8;
    if (this->degrees_of_freedom <= uVar32) {
      return Working;
    }
  } while( true );
}

Assistant:

Result calculate(const InputParameter<DOFs, CustomVector>& inp, Trajectory<DOFs, CustomVector>& traj, double delta_time, bool& was_interrupted) {
        was_interrupted = false;
#if defined WITH_CLOUD_CLIENT
        traj.resize(0);
#endif

        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            auto& p = traj.profiles[0][dof];

            inp_min_velocity[dof] = inp.min_velocity ? inp.min_velocity.value()[dof] : -inp.max_velocity[dof];
            inp_min_acceleration[dof] = inp.min_acceleration ? inp.min_acceleration.value()[dof] : -inp.max_acceleration[dof];
            inp_per_dof_control_interface[dof] = inp.per_dof_control_interface ? inp.per_dof_control_interface.value()[dof] : inp.control_interface;
            inp_per_dof_synchronization[dof] = inp.per_dof_synchronization ? inp.per_dof_synchronization.value()[dof] : inp.synchronization;

            if (!inp.enabled[dof]) {
                p.p.back() = inp.current_position[dof];
                p.v.back() = inp.current_velocity[dof];
                p.a.back() = inp.current_acceleration[dof];
                p.t_sum.back() = 0.0;
                blocks[dof].t_min = 0.0;
                blocks[dof].a = std::nullopt;
                blocks[dof].b = std::nullopt;
                continue;
            }

            // Calculate brake (if input exceeds or will exceed limits)
            switch (inp_per_dof_control_interface[dof]) {
                case ControlInterface::Position: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        p.brake.get_position_brake_trajectory(inp.current_velocity[dof], inp.current_acceleration[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                        // p.accel.get_position_brake_trajectory(inp.target_velocity[dof], inp.target_acceleration[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                    } else if (!std::isinf(inp.max_acceleration[dof])) {
                        p.brake.get_second_order_position_brake_trajectory(inp.current_velocity[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                        // p.accel.get_second_order_position_brake_trajectory(inp.target_velocity[dof], inp.target_acceleration[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                    }
                    p.set_boundary(inp.current_position[dof], inp.current_velocity[dof], inp.current_acceleration[dof], inp.target_position[dof], inp.target_velocity[dof], inp.target_acceleration[dof]);
                } break;
                case ControlInterface::Velocity: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        p.brake.get_velocity_brake_trajectory(inp.current_acceleration[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                        // p.accel.get_velocity_brake_trajectory(inp.target_acceleration[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                    } else {
                        p.brake.get_second_order_velocity_brake_trajectory();
                        // p.accel.get_second_order_velocity_brake_trajectory();
                    }
                    p.set_boundary_for_velocity(inp.current_position[dof], inp.current_velocity[dof], inp.current_acceleration[dof], inp.target_velocity[dof], inp.target_acceleration[dof]);
                } break;
            }

            // Finalize pre & post-trajectories
            if (!std::isinf(inp.max_jerk[dof])) {
                p.brake.finalize(p.p[0], p.v[0], p.a[0]);
                // p.accel.finalize(p.pf, p.vf, p.af);
            } else if (!std::isinf(inp.max_acceleration[dof])) {
                p.brake.finalize_second_order(p.p[0], p.v[0], p.a[0]);
                // p.accel.finalize_second_order(p.pf, p.vf, p.af);
            }

            bool found_profile {false};
            switch (inp_per_dof_control_interface[dof]) {
                case ControlInterface::Position: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        PositionThirdOrderStep1 step1 {p.p[0], p.v[0], p.a[0], p.pf, p.vf, p.af, inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    } else if (!std::isinf(inp.max_acceleration[dof])) {
                        PositionSecondOrderStep1 step1 {p.p[0], p.v[0], p.pf, p.vf, inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    } else {
                        PositionFirstOrderStep1 step1 {p.p[0], p.pf, inp.max_velocity[dof], inp_min_velocity[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    }
                } break;
                case ControlInterface::Velocity: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        VelocityThirdOrderStep1 step1 {p.v[0], p.a[0], p.vf, p.af, inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    } else {
                        VelocitySecondOrderStep1 step1 {p.v[0], p.vf, inp.max_acceleration[dof], inp_min_acceleration[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    }
                } break;
            }

            if (!found_profile) {
                const bool has_zero_limits = (inp.max_acceleration[dof] == 0.0 || inp_min_acceleration[dof] == 0.0 || inp.max_jerk[dof] == 0.0);
                if (has_zero_limits) {
                    if constexpr (throw_error) {
                        throw RuckigError("zero limits conflict in step 1, dof: " + std::to_string(dof) + " input: " + inp.to_string());
                    } else {
                        return Result::ErrorZeroLimits;
                    }

                } else {
                    if constexpr (throw_error) {
                        throw RuckigError("error in step 1, dof: " + std::to_string(dof) + " input: " + inp.to_string());
                    } else {
                        return Result::ErrorExecutionTimeCalculation;
                    }
                }
            }

            traj.independent_min_durations[dof] = blocks[dof].t_min;
            // std::cout << dof << " profile step1: " << blocks[dof].to_string() << std::endl;
        }

        const bool discrete_duration = (inp.duration_discretization == DurationDiscretization::Discrete);
        if (degrees_of_freedom == 1 && !inp.minimum_duration && !discrete_duration) {
            traj.duration = blocks[0].t_min;
            traj.profiles[0][0] = blocks[0].p_min;
            traj.cumulative_times[0] = traj.duration;
            return Result::Working;
        }

        std::optional<size_t> limiting_dof; // The DoF that doesn't need step 2
        const bool found_synchronization = synchronize(inp.minimum_duration, traj.duration, limiting_dof, traj.profiles[0], discrete_duration, delta_time);
        if (!found_synchronization) {
            bool has_zero_limits = false;
            for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
                if (inp.max_acceleration[dof] == 0.0 || inp_min_acceleration[dof] == 0.0 || inp.max_jerk[dof] == 0.0) {
                    has_zero_limits = true;
                    break;
                }
            }

            if (has_zero_limits) {
                if constexpr (throw_error) {
                    throw RuckigError("zero limits conflict with other degrees of freedom in time synchronization " + std::to_string(traj.duration));
                } else {
                    return Result::ErrorZeroLimits;
                }

            } else {
                if constexpr (throw_error) {
                    throw RuckigError("error in time synchronization: " + std::to_string(traj.duration));
                } else {
                    return Result::ErrorSynchronizationCalculation;
                }
            }
        }

        // None Synchronization
        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            if (inp.enabled[dof] && inp_per_dof_synchronization[dof] == Synchronization::None) {
                traj.profiles[0][dof] = blocks[dof].p_min;
                if (blocks[dof].t_min > traj.duration) {
                    traj.duration = blocks[dof].t_min;
                    limiting_dof = dof;
                }
            }
        }
        traj.cumulative_times[0] = traj.duration;

        if constexpr (return_error_at_maximal_duration) {
            if (traj.duration > 7.6e3) {
                return Result::ErrorTrajectoryDuration;
            }
        }

        if (traj.duration == 0.0) {
            // Copy all profiles for end state
            for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
                traj.profiles[0][dof] = blocks[dof].p_min;
            }
            return Result::Working;
        }

        if (!discrete_duration && std::all_of(inp_per_dof_synchronization.begin(), inp_per_dof_synchronization.end(), [](Synchronization s){ return s == Synchronization::None; })) {
            return Result::Working;
        }

        // Phase Synchronization
        if (limiting_dof && std::any_of(inp_per_dof_synchronization.begin(), inp_per_dof_synchronization.end(), [](Synchronization s){ return s == Synchronization::Phase; })) {
            const Profile& p_limiting = traj.profiles[0][limiting_dof.value()];
            if (is_input_collinear(inp, p_limiting.direction, limiting_dof.value())) {
                bool found_time_synchronization {true};
                for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
                    if (!inp.enabled[dof] || dof == limiting_dof || inp_per_dof_synchronization[dof] != Synchronization::Phase) {
                        continue;
                    }

                    Profile& p = traj.profiles[0][dof];
                    const double t_profile = traj.duration - p.brake.duration - p.accel.duration;

                    p.t = p_limiting.t; // Copy timing information from limiting DoF
                    p.control_signs = p_limiting.control_signs;

                    // Profile::ReachedLimits::NONE is a small hack, as there is no specialization for that in the check function
                    switch (inp_per_dof_control_interface[dof]) {
                        case ControlInterface::Position: {
                            switch (p.control_signs) {
                                case Profile::ControlSigns::UDDU: {
                                    if (!std::isinf(inp.max_jerk[dof])) {
                                        found_time_synchronization &= p.check_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                                    } else if (!std::isinf(inp.max_acceleration[dof])) {
                                        found_time_synchronization &= p.check_for_second_order_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], -new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                                    } else {
                                        found_time_synchronization &= p.check_for_first_order_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof]);
                                    }
                                } break;
                                case Profile::ControlSigns::UDUD: {
                                    if (!std::isinf(inp.max_jerk[dof])) {
                                        found_time_synchronization &= p.check_with_timing<Profile::ControlSigns::UDUD, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                                    } else {
                                        found_time_synchronization &= p.check_for_second_order_with_timing<Profile::ControlSigns::UDUD, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], -new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                                    }
                                } break;
                            }
                        } break;
                        case ControlInterface::Velocity: {
                            switch (p.control_signs) {
                                case Profile::ControlSigns::UDDU: {
                                    if (!std::isinf(inp.max_jerk[dof])) {
                                        found_time_synchronization &= p.check_for_velocity_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                                    } else {
                                        found_time_synchronization &= p.check_for_second_order_velocity_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                                    }
                                } break;
                                case Profile::ControlSigns::UDUD: {
                                    if (!std::isinf(inp.max_jerk[dof])) {
                                        found_time_synchronization &= p.check_for_velocity_with_timing<Profile::ControlSigns::UDUD, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                                    } else {
                                        found_time_synchronization &= p.check_for_second_order_velocity_with_timing<Profile::ControlSigns::UDUD, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                                    }
                                } break;
                            }
                        } break;
                    }

                    p.limits = p_limiting.limits; // After check method call to set correct limits
                }

                if (found_time_synchronization && std::all_of(inp_per_dof_synchronization.begin(), inp_per_dof_synchronization.end(), [](Synchronization s){ return s == Synchronization::Phase || s == Synchronization::None; })) {
                    return Result::Working;
                }
            }
        }

        // Time Synchronization
        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            const bool skip_synchronization = (dof == limiting_dof || inp_per_dof_synchronization[dof] == Synchronization::None) && !discrete_duration;
            if (!inp.enabled[dof] || skip_synchronization) {
                continue;
            }

            Profile& p = traj.profiles[0][dof];
            const double t_profile = traj.duration - p.brake.duration - p.accel.duration;

            if (inp_per_dof_synchronization[dof] == Synchronization::TimeIfNecessary && std::abs(inp.target_velocity[dof]) < eps && std::abs(inp.target_acceleration[dof]) < eps) {
                p = blocks[dof].p_min;
                continue;
            }

            // Check if the final time corresponds to an extremal profile calculated in step 1
            // Use 2*eps because of numerical robustness in duration discretization
            if (std::abs(t_profile - blocks[dof].t_min) < 2*eps) {
                p = blocks[dof].p_min;
                continue;
            } else if (blocks[dof].a && std::abs(t_profile - blocks[dof].a->right) < 2*eps) {
                p = blocks[dof].a->profile;
                continue;
            } else if (blocks[dof].b && std::abs(t_profile - blocks[dof].b->right) < 2*eps) {
                p = blocks[dof].b->profile;
                continue;
            }

            bool found_time_synchronization {false};
            switch (inp_per_dof_control_interface[dof]) {
                case ControlInterface::Position: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        PositionThirdOrderStep2 step2 {t_profile, p.p[0], p.v[0], p.a[0], p.pf, p.vf, p.af, inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    } else if (!std::isinf(inp.max_acceleration[dof])) {
                        PositionSecondOrderStep2 step2 {t_profile, p.p[0], p.v[0], p.pf, p.vf, inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    } else {
                        PositionFirstOrderStep2 step2 {t_profile, p.p[0], p.pf, inp.max_velocity[dof], inp_min_velocity[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    }
                } break;
                case ControlInterface::Velocity: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        VelocityThirdOrderStep2 step2 {t_profile, p.v[0], p.a[0], p.vf, p.af, inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    } else {
                        VelocitySecondOrderStep2 step2 {t_profile, p.v[0], p.vf, inp.max_acceleration[dof], inp_min_acceleration[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    }
                } break;
            }
            if (!found_time_synchronization) {
                if constexpr (throw_error) {
                    throw RuckigError("error in step 2 in dof: " + std::to_string(dof) + " for t sync: " + std::to_string(traj.duration) + " input: " + inp.to_string());
                } else {
                    return Result::ErrorSynchronizationCalculation;
                }
            }
            // std::cout << dof << " profile step2: " << p.to_string() << std::endl;
        }

        return Result::Working;
    }